

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

void MIR_link(MIR_context_t ctx,_func_void_MIR_context_t_MIR_item_t *set_interface,
             _func_void_ptr_char_ptr *import_resolver)

{
  MIR_module *pMVar1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  undefined8 uVar5;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  htab_size_t hVar17;
  MIR_item_type_t MVar18;
  MIR_module_t_conflict pMVar19;
  VARR_uint8_t *pVVar20;
  MIR_context_t pMVar21;
  VARR_char *pVVar22;
  MIR_label_t pMVar23;
  VARR_MIR_op_t *pVVar24;
  HTAB_MIR_item_t *pHVar25;
  undefined8 uVar26;
  MIR_insn_t pMVar27;
  MIR_func_t pMVar28;
  MIR_lref_data_t pMVar29;
  VARR_size_t *pVVar30;
  gen_ctx *pgVar31;
  VARR_MIR_var_t *pVVar32;
  MIR_var_t *pMVar33;
  VARR_MIR_reg_t *pVVar34;
  MIR_func_t func;
  VARR_MIR_insn_t *pVVar35;
  MIR_type_t type;
  anon_union_8_10_166bea1d_for_u aVar36;
  undefined8 uVar37;
  MIR_op_t op1;
  anon_union_32_12_57d33f68_for_u aVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined8 uVar41;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined6 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined1 auVar47 [16];
  undefined4 uVar48;
  undefined4 uVar50;
  anon_union_32_12_57d33f68_for_u aVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  bool bVar56;
  void **ppvVar57;
  VARR_uint8_t *pVVar58;
  VARR_MIR_proto_t *pVVar59;
  VARR_uint8_t *pVVar60;
  undefined1 uVar61;
  undefined1 uVar62;
  undefined6 uVar63;
  int iVar64;
  int iVar65;
  MIR_insn_code_t MVar66;
  MIR_reg_t MVar67;
  VARR_MIR_module_t *pVVar68;
  void *addr;
  MIR_op_t *pMVar69;
  simplify_ctx *psVar70;
  MIR_item_t pMVar71;
  ulong uVar72;
  MIR_insn_t_conflict pMVar73;
  reg_desc_t *prVar74;
  MIR_insn_t_conflict pMVar75;
  MIR_insn_t_conflict *ppMVar76;
  size_t *psVar77;
  MIR_insn_t_conflict pMVar78;
  MIR_insn_t_conflict pMVar79;
  MIR_insn_t_conflict pMVar80;
  MIR_insn_t_conflict pMVar81;
  uint uVar82;
  uint uVar83;
  MIR_insn_t_conflict insn_1;
  MIR_item_t_conflict pMVar84;
  MIR_item_t_conflict pMVar85;
  VARR_char *pVVar86;
  MIR_insn_t pMVar87;
  MIR_context_t pMVar88;
  MIR_func_t extraout_RDX;
  MIR_func_t pMVar89;
  uint *func_00;
  MIR_func_t extraout_RDX_00;
  VARR_char *pVVar90;
  MIR_label_t label;
  size_t sVar91;
  MIR_func_t func_01;
  VARR_MIR_insn_t *extraout_RDX_01;
  VARR_MIR_insn_t *pVVar92;
  VARR_MIR_insn_t *extraout_RDX_02;
  VARR_MIR_insn_t *extraout_RDX_03;
  ulong uVar93;
  MIR_lref_data *pMVar94;
  MIR_context_t unaff_RBP;
  int *piVar95;
  MIR_type_t MVar96;
  MIR_item_t_conflict pMVar97;
  ulong uVar98;
  MIR_context_t pMVar99;
  char *pcVar100;
  MIR_error_type_t MVar101;
  MIR_insn_code_t MVar102;
  MIR_item_t_conflict pMVar103;
  MIR_item_t_conflict unaff_R13;
  long lVar104;
  MIR_context_t unaff_R14;
  anon_union_8_10_166bea1d_for_u *paVar105;
  bool bVar106;
  undefined1 auVar107 [32];
  int func_top_alloca_used_p;
  int64_t alloca_size;
  int called_func_top_alloca_used_p;
  int non_top_alloca_p;
  int out_p;
  anon_union_16_8_da7ae194 v;
  MIR_op_t op;
  MIR_op_t op_3;
  MIR_op_t reg_op;
  MIR_op_t op_2;
  MIR_op_t op_1;
  MIR_op_t op_14;
  MIR_op_t op_13;
  MIR_op_t op_25;
  MIR_op_t op_24;
  MIR_op_t op_23;
  MIR_op_t op_22;
  MIR_op_t op_21;
  MIR_op_t op_20;
  MIR_op_t op_19;
  MIR_op_t op_18;
  MIR_op_t op_17;
  MIR_op_t op_4;
  MIR_op_t op_16;
  MIR_op_t op_15;
  MIR_op_t op_12;
  MIR_op_t op_11;
  int in_stack_fffffffffffff8f0;
  MIR_context_t local_680;
  ulong local_678;
  ulong local_670;
  MIR_item_t_conflict local_668;
  MIR_insn_t_conflict local_660;
  ulong local_650;
  MIR_context_t local_648;
  MIR_insn_t_conflict local_638;
  MIR_insn_t_conflict local_630;
  MIR_insn_t_conflict local_628;
  MIR_context_t local_620;
  uint local_618;
  int local_614;
  MIR_insn_t_conflict local_610;
  undefined1 local_608 [36];
  undefined4 uStack_5e4;
  undefined1 uStack_5e0;
  undefined1 uStack_5df;
  undefined6 uStack_5de;
  anon_union_32_12_57d33f68_for_u aStack_5d8;
  anon_union_8_10_166bea1d_for_u *local_5a8;
  unkbyte10 local_598;
  undefined1 local_588;
  undefined1 uStack_587;
  undefined2 uStack_586;
  undefined4 uStack_584;
  undefined2 uStack_580;
  MIR_insn_t_conflict local_578;
  MIR_context_t local_570;
  _func_void_MIR_context_t_MIR_item_t *local_568;
  MIR_context_t local_560;
  undefined8 local_558;
  undefined1 uStack_550;
  undefined7 uStack_54f;
  MIR_reg_t MStack_548;
  MIR_item_t_conflict local_528;
  undefined1 uStack_520;
  undefined7 uStack_51f;
  MIR_reg_t MStack_518;
  undefined4 uStack_514;
  anon_union_8_10_166bea1d_for_u local_4f8;
  char cStack_4f0;
  undefined1 uStack_4ef;
  undefined6 uStack_4ee;
  MIR_reg_t MStack_4e8;
  undefined4 uStack_4e4;
  MIR_func_t pMStack_4e0;
  MIR_func_t pMStack_4d8;
  MIR_func_t pMStack_4d0;
  undefined8 local_468;
  undefined1 uStack_460;
  MIR_item_t_conflict pMStack_458;
  undefined8 local_438;
  undefined1 uStack_430;
  MIR_reg_t MStack_428;
  ulong local_400;
  MIR_insn_t local_3f8;
  int *local_3f0;
  MIR_insn_t_conflict local_3e8;
  anon_union_32_12_57d33f68_for_u *local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined1 uStack_390;
  undefined2 uStack_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  MIR_reg_t local_378;
  undefined4 local_374;
  undefined8 local_370;
  undefined8 local_368;
  undefined1 uStack_360;
  undefined2 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  MIR_reg_t local_348;
  undefined4 local_344;
  undefined8 local_340;
  undefined8 local_338;
  undefined2 uStack_330;
  undefined6 uStack_32e;
  MIR_reg_t MStack_328;
  undefined8 local_308;
  undefined1 uStack_300;
  long lStack_2f8;
  undefined8 local_2d8;
  undefined1 uStack_2d0;
  undefined7 uStack_2cf;
  MIR_reg_t MStack_2c8;
  undefined1 auStack_2c4 [12];
  undefined8 local_2a8;
  undefined1 uStack_2a0;
  MIR_reg_t MStack_298;
  undefined8 local_278;
  undefined1 uStack_270;
  undefined8 uStack_268;
  undefined8 local_248;
  undefined1 uStack_240;
  MIR_reg_t MStack_238;
  undefined8 local_218;
  undefined1 uStack_210;
  MIR_reg_t MStack_208;
  undefined8 local_1e8;
  undefined1 uStack_1e0;
  undefined7 uStack_1df;
  MIR_reg_t MStack_1d8;
  undefined8 local_1b8;
  undefined1 uStack_1b0;
  MIR_reg_t MStack_1a8;
  undefined8 local_188;
  undefined1 uStack_180;
  undefined4 uStack_178;
  undefined8 local_158;
  undefined1 uStack_150;
  undefined7 uStack_14f;
  MIR_reg_t MStack_148;
  undefined8 local_128;
  undefined2 uStack_120;
  undefined4 uStack_118;
  undefined8 local_f8;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  MIR_insn_t_conflict pMStack_e8;
  undefined8 local_c8;
  undefined1 uStack_c0;
  undefined8 uStack_b8;
  undefined8 local_98;
  undefined1 uStack_90;
  MIR_insn_t_conflict pMStack_88;
  undefined8 local_68;
  undefined1 uStack_60;
  undefined8 uStack_58;
  undefined1 auVar108 [16];
  undefined1 auVar109 [24];
  undefined8 uVar49;
  
  pVVar68 = ctx->modules_to_link;
  pMVar88 = ctx;
  local_568 = set_interface;
  if (pVVar68 != (VARR_MIR_module_t *)0x0) {
    pMVar1 = &ctx->environment_module;
    pMVar99 = (MIR_context_t)0x0;
    do {
      unaff_RBP = ctx;
      local_680 = ctx;
      if ((MIR_context_t)pVVar68->els_num <= pMVar99) goto LAB_00135322;
      if (pVVar68->varr == (MIR_module_t_conflict *)0x0) {
        MIR_link_cold_41();
LAB_001372c7:
        MIR_link_cold_7();
        goto LAB_001372cc;
      }
      pMVar19 = pVVar68->varr[(long)pMVar99];
      ctx->simplify_ctx->new_label_num = 0;
      pVVar20 = ctx->used_label_p;
      local_560 = pMVar99;
      if ((pVVar20 == (VARR_uint8_t *)0x0) || (pVVar20->varr == (uint8_t *)0x0)) {
LAB_0013725a:
        MIR_link_cold_40();
LAB_00137262:
        __assert_fail("insn->code != MIR_JRET",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x101a,"void process_inlines(MIR_context_t, MIR_item_t)");
      }
      pVVar20->els_num = 0;
      for (unaff_R13 = (pMVar19->items).head; uVar63 = uStack_5de, uVar62 = uStack_5df,
          uVar61 = uStack_5e0, unaff_R13 != (MIR_item_t_conflict)0x0;
          unaff_R13 = (unaff_R13->item_link).next) {
        uStack_5e0 = SUB81(pMVar19,0);
        uStack_5df = (undefined1)((ulong)pMVar19 >> 8);
        uStack_5de = (undefined6)((ulong)pMVar19 >> 0x10);
        switch(unaff_R13->item_type) {
        case MIR_func_item:
          uStack_5e0 = uVar61;
          uStack_5df = uVar62;
          uStack_5de = uVar63;
          if (unaff_R13->data != (void *)0x0) {
            __assert_fail("item->data == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x7b1,
                          "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                         );
          }
          if (unaff_R13->item_type == MIR_func_item) {
            pMVar88 = (MIR_context_t)ctx->simplify_ctx->val_tab;
            HTAB_val_t_clear((HTAB_val_t *)pMVar88);
            pMVar28 = (unaff_R13->u).func;
            if (pMVar28->nargs != 0) {
              lVar104 = 8;
              uVar98 = 0;
              pMVar89 = extraout_RDX;
              do {
                pVVar32 = pMVar28->vars;
                if (((pVVar32 == (VARR_MIR_var_t *)0x0) ||
                    (pMVar33 = pVVar32->varr, pMVar33 == (MIR_var_t *)0x0)) ||
                   (pVVar32->els_num <= uVar98)) {
                  MIR_link_cold_24();
                  goto LAB_00137039;
                }
                unaff_R14 = *(MIR_context_t *)((long)&pMVar33->type + lVar104);
                func_00 = &switchD_00133f3f::switchdataD_001ae0dc;
                switch(*(undefined4 *)((long)pMVar33 + lVar104 + -8)) {
                case 0:
                  bVar106 = false;
                  MVar102 = MIR_EXT8;
                  goto LAB_00133f73;
                case 1:
                  MVar102 = MIR_UEXT8;
                  break;
                case 2:
                  MVar102 = MIR_EXT16;
                  break;
                case 3:
                  MVar102 = MIR_UEXT16;
                  break;
                case 4:
                  MVar102 = MIR_EXT32;
                  break;
                case 5:
                  MVar102 = MIR_UEXT32;
                  break;
                case 6:
                case 7:
                case 8:
                case 9:
                case 10:
                  goto switchD_00133f3f_caseD_6;
                default:
                  MVar102 = MIR_INVALID_INSN;
                  bVar106 = true;
                  func_00 = (uint *)pMVar89;
                  goto LAB_00133f73;
                }
                bVar106 = false;
LAB_00133f73:
                if (!bVar106) {
                  prVar74 = find_rd_by_name(unaff_R14,(char *)pMVar28,(MIR_func_t)func_00);
                  if (prVar74 == (reg_desc_t *)0x0) goto LAB_0013708d;
                  MStack_548 = prVar74->reg;
                  uStack_550 = 1;
                  local_558 = 0;
                  uStack_430 = 1;
                  local_438 = 0;
                  auVar39._9_7_ = uStack_54f;
                  auVar39._0_9_ = (unkuint9)1 << 0x40;
                  in_stack_fffffffffffff8f0 = auVar39._8_4_;
                  MStack_428 = MStack_548;
                  pMVar81 = MIR_new_insn(ctx,MVar102);
                  pMVar88 = ctx;
                  MIR_prepend_insn(ctx,unaff_R13,pMVar81);
                  func_00 = (uint *)extraout_RDX_00;
                }
switchD_00133f3f_caseD_6:
                uVar98 = uVar98 + 1;
                lVar104 = lVar104 + 0x18;
                pMVar89 = (MIR_func_t)func_00;
              } while (uVar98 < pMVar28->nargs);
            }
            psVar70 = ctx->simplify_ctx;
            pVVar92 = psVar70->temp_insns;
            if ((pVVar92 != (VARR_MIR_insn_t *)0x0) && (pVVar92->varr != (MIR_insn_t_conflict *)0x0)
               ) {
              pVVar92->els_num = 0;
              pVVar92 = psVar70->labels;
              if ((pVVar92 != (VARR_MIR_insn_t *)0x0) &&
                 (pVVar92->varr != (MIR_insn_t_conflict *)0x0)) {
                pVVar92->els_num = 0;
                unaff_R14 = (MIR_context_t)(pMVar28->insns).head;
                if (unaff_R14 == (MIR_context_t)0x0) {
                  bVar106 = true;
                }
                else {
                  bVar106 = false;
                  iVar64 = 0;
                  local_650 = (ulong)pMVar28 & 0xffffffff;
                  do {
                    uVar98 = *(ulong *)&unaff_R14->func_redef_permission_p;
                    MVar102 = (MIR_insn_code_t)uVar98;
                    if (((MVar102 < MIR_EXT8) && (*(char *)&unaff_R14->unspec_protos == '\n')) &&
                       (*(char *)&(unaff_R14->environment_module).name == '\n')) {
                      if (MVar102 == MIR_MOV) {
                        MVar96 = MIR_T_I64;
                      }
                      else if (MVar102 == MIR_FMOV) {
                        MVar96 = MIR_T_F;
                      }
                      else {
                        MVar96 = (MVar102 != MIR_DMOV) + MIR_T_D;
                      }
                      MStack_4e8 = new_temp_reg(ctx,MVar96,pMVar28);
                      uVar82 = ((uint)local_650 & 0xffffff00) + 1;
                      local_4f8.func = (MIR_func_t)0x0;
                      local_650 = (ulong)uVar82;
                      cStack_4f0 = (char)uVar82;
                      uStack_4ef = (undefined1)(uVar82 >> 8);
                      in_stack_fffffffffffff8f0 = (int)unaff_R14->unspec_protos;
                      pMVar81 = MIR_new_insn(ctx,MVar102);
                      pMVar88 = ctx;
                      MIR_insert_insn_after(ctx,unaff_R13,(MIR_insn_t_conflict)unaff_R14,pMVar81);
                      uVar42 = cStack_4f0;
                      uVar41 = local_4f8.func;
                      auVar108[8] = uVar42;
                      auVar108._0_8_ = uVar41;
                      uVar43 = uStack_4ef;
                      auVar108[9] = uVar43;
                      uVar44 = uStack_4ee;
                      auVar108._10_6_ = uVar44;
                      uVar45 = MStack_4e8;
                      auVar109._16_4_ = uVar45;
                      auVar109._0_16_ = auVar108;
                      uVar46 = uStack_4e4;
                      auVar109._20_4_ = uVar46;
                      uVar50 = uStack_4e4;
                      uVar48 = MStack_4e8;
                      uVar49 = CONCAT44(uVar50,uVar48);
                      unaff_R14->temp_string = (VARR_char *)uVar49;
                      unaff_R14->temp_data = (VARR_uint8_t *)pMStack_4e0;
                      unaff_R14->used_label_p = (VARR_uint8_t *)pMStack_4d8;
                      unaff_R14->module_item_tab = (HTAB_MIR_item_t *)pMStack_4d0;
                      unaff_R14->insn_nops = (VARR_size_t *)local_4f8;
                      unaff_R14->unspec_protos = (VARR_MIR_proto_t *)auVar108._8_8_;
                      unaff_R14->temp_string = (VARR_char *)auVar109._16_8_;
                      unaff_R14->temp_data = (VARR_uint8_t *)pMStack_4e0;
                    }
                    if (MVar102 == MIR_LABEL) {
                      pVVar92 = ctx->simplify_ctx->labels;
                      pMVar88 = (MIR_context_t)pVVar92->varr;
                      if (pMVar88 == (MIR_context_t)0x0) goto LAB_00137085;
LAB_00134361:
                      uVar72 = pVVar92->els_num + 1;
                      if (pVVar92->size < uVar72) {
                        sVar91 = (uVar72 >> 1) + uVar72;
                        ppMVar76 = (MIR_insn_t_conflict *)realloc(pMVar88,sVar91 * 8);
                        pVVar92->varr = ppMVar76;
                        pVVar92->size = sVar91;
                      }
                      sVar91 = pVVar92->els_num;
                      pVVar92->els_num = sVar91 + 1;
                      pVVar92->varr[sVar91] = (MIR_insn_t_conflict)unaff_R14;
                    }
                    else if (MVar102 == MIR_RET) {
                      pVVar92 = ctx->simplify_ctx->temp_insns;
                      pMVar88 = (MIR_context_t)pVVar92->varr;
                      if (pMVar88 != (MIR_context_t)0x0) goto LAB_00134361;
                      goto LAB_0013707d;
                    }
                    pMVar99 = (MIR_context_t)unaff_R14->error_func;
                    if ((MVar102 == MIR_ALLOCA) &&
                       ((ushort)(*(byte *)&(unaff_R14->environment_module).name - 3) < 2)) {
                      pMVar103 = (unaff_R14->environment_module).items.head;
                      pMVar84 = (MIR_item_t_conflict)0x1;
                      if (1 < (long)pMVar103) {
                        pMVar84 = pMVar103;
                      }
                      local_668 = (MIR_item_t_conflict)((ulong)(8 < (long)pMVar103) * 8 + 8);
                      if ((long)pMVar103 < 5) {
                        local_668 = (MIR_item_t_conflict)0x4;
                      }
                      if ((long)pMVar103 < 3) {
                        local_668 = pMVar84;
                      }
                      puVar4 = (undefined1 *)((long)&pMVar84[-1].u + 7) + (long)local_668;
                      pMVar103 = (MIR_item_t_conflict)(puVar4 + -((long)puVar4 % (long)local_668));
                      if (pMVar99 != (MIR_context_t)0x0) {
                        do {
                          if ((pMVar99->func_redef_permission_p != 0xad) ||
                             (1 < (ushort)(*(byte *)&(pMVar99->environment_module).name - 3)))
                          break;
                          uVar5 = unaff_R14->insn_nops;
                          uVar8 = unaff_R14->unspec_protos;
                          uVar13 = unaff_R14->temp_string;
                          uVar15 = unaff_R14->temp_data;
                          op1.u.str.s = (char *)uVar15;
                          op1.u.i = uVar13;
                          op1._8_8_ = uVar8;
                          op1.data = (void *)uVar5;
                          uVar14 = unaff_R14->used_label_p;
                          uVar16 = unaff_R14->module_item_tab;
                          in_stack_fffffffffffff8f0 = (int)uVar8;
                          op1.u._16_8_ = uVar14;
                          op1.u.mem.disp = uVar16;
                          iVar65 = MIR_op_eq_p(pMVar88,op1,*(MIR_op_t *)&pMVar99->insn_nops);
                          if (iVar65 != 0) break;
                          pMVar84 = (pMVar99->environment_module).items.head;
                          pMVar85 = (MIR_item_t_conflict)0x1;
                          if (1 < (long)pMVar84) {
                            pMVar85 = pMVar84;
                          }
                          pMVar97 = (MIR_item_t_conflict)((ulong)(8 < (long)pMVar84) * 8 + 8);
                          if ((long)pMVar84 < 5) {
                            pMVar97 = (MIR_item_t_conflict)0x4;
                          }
                          if ((long)pMVar84 < 3) {
                            pMVar97 = pMVar85;
                          }
                          puVar4 = (undefined1 *)((long)&pMVar85[-1].u + 7) + (long)pMVar97;
                          if (local_668 < pMVar97) {
                            puVar3 = (undefined1 *)((long)&pMVar97[-1].u + 7) + (long)pMVar103;
                            pMVar103 = (MIR_item_t_conflict)
                                       (puVar3 + -((long)puVar3 % (long)pMVar97));
                            local_668 = pMVar97;
                          }
                          uStack_460 = 3;
                          local_468 = 0;
                          uVar9 = pMVar99->unspec_protos;
                          in_stack_fffffffffffff8f0 = (int)uVar9;
                          pMStack_458 = pMVar103;
                          pMVar81 = MIR_new_insn(ctx,MIR_ADD);
                          pMVar103 = (MIR_item_t_conflict)
                                     ((long)pMVar103 + ((long)puVar4 - (long)puVar4 % (long)pMVar97)
                                     );
                          MIR_insert_insn_before(ctx,unaff_R13,(MIR_insn_t_conflict)pMVar99,pMVar81)
                          ;
                          pMVar88 = ctx;
                          remove_insn(ctx,unaff_R13,(MIR_insn_t_conflict)pMVar99,
                                      &((unaff_R13->u).func)->insns);
                          pMVar99 = (MIR_context_t)(pMVar81->insn_link).next;
                        } while (pMVar99 != (MIR_context_t)0x0);
                      }
                      (unaff_R14->environment_module).items.head = pMVar103;
                      pMVar99 = (MIR_context_t)unaff_R14->error_func;
                    }
                    if (0xfffffffc < MVar102 - MIR_SWITCH) {
                      bVar106 = true;
                    }
                    uVar82 = MVar102 - MIR_BT;
                    if (((MVar102 == MIR_JMP) ||
                        ((uVar82 < 0x2e & (byte)(0x3c78f1e3c63f >> ((ulong)uVar82 & 0x3f))) != 0))
                       && (*(char *)&unaff_R14->unspec_protos == '\f')) {
                      for (pMVar21 = pMVar99;
                          ((pMVar21 != (MIR_context_t)0x0 &&
                           (pMVar21 != (MIR_context_t)unaff_R14->temp_string)) &&
                          (pMVar21->func_redef_permission_p == 0xb4));
                          pMVar21 = (MIR_context_t)pMVar21->error_func) {
                      }
                      if (pMVar21 != (MIR_context_t)unaff_R14->temp_string) goto LAB_00134680;
                      goto LAB_00134a46;
                    }
LAB_00134680:
                    uVar83 = MVar102 - MIR_ADD;
                    if (uVar83 < 0x26) {
                      if ((0x3ff0000063U >> ((ulong)uVar83 & 0x3f) & 1) == 0) {
                        if ((0x18c00UL >> ((ulong)uVar83 & 0x3f) & 1) == 0) goto LAB_0013476a;
                        goto LAB_00134778;
                      }
LAB_001346a2:
                      if ((*(char *)&unaff_R14->curr_module != '\x03') ||
                         (unaff_R14->curr_func != (MIR_func_t)0x0)) goto LAB_001346ba;
LAB_00134790:
                      uVar10 = unaff_R14->unspec_protos;
                      in_stack_fffffffffffff8f0 = (int)uVar10;
                      iVar64 = MIR_op_eq_p(pMVar88,*(MIR_op_t *)&unaff_R14->insn_nops,
                                           *(MIR_op_t *)&unaff_R14->environment_module);
                      if (iVar64 == 0) {
                        uVar11 = unaff_R14->unspec_protos;
                        in_stack_fffffffffffff8f0 = (int)uVar11;
                        MVar102 = MIR_MOV;
LAB_00134899:
                        pMVar99 = (MIR_context_t)MIR_new_insn(ctx,MVar102);
                        MIR_insert_insn_before
                                  (ctx,unaff_R13,(MIR_insn_t_conflict)unaff_R14,
                                   (MIR_insn_t_conflict)pMVar99);
                      }
LAB_001348b7:
                      pMVar88 = ctx;
                      remove_insn(ctx,unaff_R13,(MIR_insn_t_conflict)unaff_R14,
                                  &((unaff_R13->u).func)->insns);
                      iVar64 = 0;
                      unaff_R14 = pMVar99;
                    }
                    else {
LAB_0013476a:
                      if (MVar102 - MIR_MULO < 2) {
LAB_00134778:
                        if ((*(char *)&unaff_R14->curr_module == '\x03') &&
                           (unaff_R14->curr_func == (MIR_func_t)&DAT_00000001)) goto LAB_00134790;
                        if ((MVar102 - MIR_OR < 10) ||
                           ((MVar102 < MIR_FSUB && ((0x18c00000000U >> (uVar98 & 0x3f) & 1) != 0))))
                        goto LAB_001346a2;
                      }
LAB_001346ba:
                      if (((((uVar82 < 0x2e) &&
                            ((0x3c78f1e3c63fU >> ((ulong)uVar82 & 0x3f) & 1) != 0)) &&
                           (pMVar99 != (MIR_context_t)0x0)) &&
                          ((pMVar99->func_redef_permission_p == 0x76 &&
                           (*(char *)&unaff_R14->unspec_protos == '\f')))) &&
                         (*(char *)&pMVar99->unspec_protos == '\f')) {
                        pVVar86 = pMVar99->temp_string;
                        pVVar90 = unaff_R14->temp_string;
                        pVVar22 = pVVar86;
                        while (((pVVar22 != (VARR_char *)0x0 && (pVVar22 != pVVar90)) &&
                               ((int)pVVar22[1].els_num == 0xb4))) {
                          pVVar22 = (VARR_char *)pVVar22->varr;
                        }
                        if (pVVar22 != pVVar90) {
                          while (((pVVar90 != (VARR_char *)0x0 && (pVVar90 != pVVar86)) &&
                                 ((int)pVVar90[1].els_num == 0xb4))) {
                            pVVar90 = (VARR_char *)pVVar90->varr;
                          }
                          if (pVVar90 != pVVar86) goto LAB_00134847;
                        }
LAB_00134a46:
                        pMVar88 = ctx;
                        remove_insn(ctx,unaff_R13,(MIR_insn_t_conflict)unaff_R14,
                                    &((unaff_R13->u).func)->insns);
                        iVar64 = 0;
                        unaff_R14 = pMVar99;
                      }
                      else {
LAB_00134847:
                        if (((uVar82 < 4) &&
                            (*(char *)&(unaff_R14->environment_module).name == '\x03')) &&
                           (pMVar103 = (unaff_R14->environment_module).items.head,
                           pMVar103 < (MIR_item_t_conflict)0x2)) {
                          if (uVar82 < 2 != (pMVar103 != (MIR_item_t_conflict)0x1)) {
                            uVar12 = unaff_R14->unspec_protos;
                            in_stack_fffffffffffff8f0 = (int)uVar12;
                            MVar102 = MIR_JMP;
                            goto LAB_00134899;
                          }
                          goto LAB_001348b7;
                        }
                        uVar72 = *(ulong *)&unaff_R14->func_redef_permission_p;
                        pMVar88 = (MIR_context_t)(uVar72 & 0xffffffff);
                        MVar66 = MIR_reverse_branch_code((MIR_insn_code_t)uVar72);
                        if (((MVar66 != MIR_INSN_BOUND && pMVar99 != (MIR_context_t)0x0) &&
                            (pMVar99->func_redef_permission_p == 0x76)) &&
                           ((pVVar86 = (VARR_char *)pMVar99->error_func, pVVar86 != (VARR_char *)0x0
                            && (((int)pVVar86[1].els_num == 0xb4 &&
                                (*(char *)&unaff_R14->unspec_protos == '\f')))))) {
                          do {
                            if ((pVVar86 == unaff_R14->temp_string) ||
                               (uVar82 = (uint)pVVar86[1].els_num,
                               pMVar88 = (MIR_context_t)(ulong)uVar82, uVar82 != 0xb4)) break;
                            pVVar86 = (VARR_char *)pVVar86->varr;
                          } while (pVVar86 != (VARR_char *)0x0);
                          if (pVVar86 == unaff_R14->temp_string) {
                            pVVar30 = pMVar99->insn_nops;
                            pVVar59 = pMVar99->unspec_protos;
                            pVVar86 = pMVar99->temp_string;
                            pVVar60 = pMVar99->temp_data;
                            pVVar20 = pMVar99->temp_data;
                            pVVar58 = pMVar99->used_label_p;
                            pHVar25 = pMVar99->module_item_tab;
                            unaff_R14->temp_string = pMVar99->temp_string;
                            unaff_R14->temp_data = pVVar20;
                            unaff_R14->used_label_p = pVVar58;
                            unaff_R14->module_item_tab = pHVar25;
                            unaff_R14->insn_nops = pVVar30;
                            unaff_R14->unspec_protos = pVVar59;
                            unaff_R14->temp_string = pVVar86;
                            unaff_R14->temp_data = pVVar60;
                            *(ulong *)&unaff_R14->func_redef_permission_p =
                                 uVar72 & 0xffffffff00000000 | (ulong)MVar66;
                            pMVar88 = ctx;
                            remove_insn(ctx,unaff_R13,(MIR_insn_t_conflict)pMVar99,
                                        &((unaff_R13->u).func)->insns);
                            iVar64 = 0;
                            goto LAB_00134b68;
                          }
                        }
                        if ((MVar102 - MIR_JMP < 0x2f) &&
                           (*(char *)&unaff_R14->unspec_protos == '\f')) {
                          pVVar86 = unaff_R14->temp_string;
                          while ((pVVar86 != (VARR_char *)0x0 && ((int)pVVar86[1].els_num == 0xb4)))
                          {
                            pVVar86 = (VARR_char *)pVVar86->varr;
                          }
                          if ((pVVar86 != (VARR_char *)0x0) &&
                             (iVar64 < 0x1f && (int)pVVar86[1].els_num == 0x76)) {
                            iVar64 = iVar64 + 1;
                            auVar6 = *(undefined1 (*) [32])&pVVar86[1].size;
                            auVar7 = *(undefined1 (*) [32])(pVVar86 + 2);
                            unaff_R14->temp_string = (VARR_char *)auVar7._0_8_;
                            unaff_R14->temp_data = (VARR_uint8_t *)auVar7._8_8_;
                            unaff_R14->used_label_p = (VARR_uint8_t *)auVar7._16_8_;
                            unaff_R14->module_item_tab = (HTAB_MIR_item_t *)auVar7._24_8_;
                            unaff_R14->insn_nops = (VARR_size_t *)auVar6._0_8_;
                            unaff_R14->unspec_protos = (VARR_MIR_proto_t *)auVar6._8_8_;
                            unaff_R14->temp_string = (VARR_char *)auVar6._16_8_;
                            unaff_R14->temp_data = (VARR_uint8_t *)auVar6._24_8_;
                            goto LAB_00134b68;
                          }
                        }
                        if (MVar102 == MIR_SWITCH || MVar102 - MIR_JMP < 0x2f) {
                          uVar93 = 1;
                          if ((char)uVar98 == -0x5b) {
                            uVar72 = 2;
                          }
                          else {
                            if ((MVar102 & (MIR_BNE|MIR_LDBEQ)) != MIR_SWITCH) goto LAB_00134a23;
                            uVar72 = uVar72 >> 0x20;
                          }
LAB_00134a7b:
                          if ((uint)uVar93 < (uint)uVar72) {
                            do {
                              pMVar23 = (MIR_label_t)(&unaff_R14->temp_string)[uVar93 * 6];
                              if (*(int *)&pMVar23->field_0x18 != 0xb4) {
                                __assert_fail("label->code == MIR_LABEL",
                                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                              ,0xe36,"MIR_insn_t last_label(MIR_label_t)");
                              }
                              pMVar27 = pMVar23;
                              do {
                                label = pMVar27;
                                pMVar27 = (label->insn_link).next;
                                if (pMVar27 == (MIR_insn_t)0x0) break;
                              } while (*(int *)&pMVar27->field_0x18 == 0xb4);
                              if (label != pMVar23) {
                                (&unaff_R14->temp_string)[uVar93 * 6] = (VARR_char *)label;
                              }
                              pMVar88 = ctx;
                              mark_used_label(ctx,label);
                              uVar93 = uVar93 + 1;
                            } while (uVar93 != uVar72);
                          }
                        }
                        else {
                          if (MVar102 - MIR_PRBEQ < 2) {
LAB_00134a23:
                            uVar72 = 1;
                            uVar93 = 0;
                            goto LAB_00134a7b;
                          }
                          if (MVar102 == MIR_LADDR) {
                            uVar72 = 2;
                            uVar93 = 1;
                            goto LAB_00134a7b;
                          }
                        }
                        uVar98 = *(ulong *)&unaff_R14->func_redef_permission_p;
                        uVar72 = uVar98 >> 0x20;
                        if (uVar72 != 0) {
                          sVar91 = 0;
                          do {
                            MIR_insn_op_mode(ctx,(MIR_insn_t_conflict)unaff_R14,sVar91,
                                             (int *)(local_608 + 0x20));
                            pMVar88 = ctx;
                            simplify_op(ctx,unaff_R13,(MIR_insn_t_conflict)unaff_R14,(int)sVar91,
                                        local_608._32_4_,(MIR_insn_code_t)uVar98,
                                        (uint)(sVar91 == 1 &&
                                              unaff_R14->func_redef_permission_p - 0xa7U < 3),
                                        in_stack_fffffffffffff8f0);
                            sVar91 = sVar91 + 1;
                          } while (uVar72 != sVar91);
                        }
                        iVar64 = 0;
                        unaff_R14 = pMVar99;
                      }
                    }
LAB_00134b68:
                  } while (unaff_R14 != (MIR_context_t)0x0);
                  bVar106 = !bVar106;
                }
                pVVar92 = ctx->simplify_ctx->temp_insns;
                if (pVVar92 == (VARR_MIR_insn_t *)0x0) goto LAB_00137201;
                sVar91 = pVVar92->els_num;
                if (sVar91 != 0) {
                  if (pVVar92->varr == (MIR_insn_t_conflict *)0x0) {
                    MIR_link_cold_31();
LAB_0013724d:
                    MIR_link_cold_5();
LAB_00137252:
                    MIR_link_cold_6();
                    goto LAB_0013725a;
                  }
                  pVVar24 = ctx->temp_ops;
                  if ((pVVar24 == (VARR_MIR_op_t *)0x0) || (pVVar24->varr == (MIR_op_t *)0x0)) {
                    MIR_link_cold_30();
                    goto LAB_00137166;
                  }
                  unaff_R14 = (MIR_context_t)(unaff_R13->u).func;
                  pHVar25 = unaff_R14->module_item_tab;
                  pMVar81 = pVVar92->varr[sVar91 - 1];
                  pVVar24->els_num = 0;
                  if (sVar91 == 1) {
                    local_660 = (MIR_insn_t_conflict)0x0;
                  }
                  else {
                    sVar91 = ctx->curr_label_num + 1;
                    ctx->curr_label_num = sVar91;
                    local_660 = create_label(ctx,sVar91);
                    pMVar88 = ctx;
                    MIR_insert_insn_before(ctx,unaff_R13,pMVar81,local_660);
                  }
                  if (*(int *)&unaff_R14->temp_data != 0) {
                    paVar105 = (anon_union_8_10_166bea1d_for_u *)pMVar81->ops;
                    unaff_RBP = (MIR_context_t)0x0;
                    local_670 = (ulong)pMVar81 & 0xffffffff;
                    do {
                      aVar36 = paVar105[1];
                      aStack_5d8.str.s = (char *)paVar105[3].func;
                      aStack_5d8.mem.disp = (MIR_disp_t)paVar105[5].func;
                      aStack_5d8.mem.base = SUB84(paVar105[4],0);
                      aStack_5d8.mem.index = SUB84(paVar105[4],4);
                      local_608._32_4_ = SUB84(*(MIR_func_t *)paVar105,0);
                      uStack_5e4 = SUB84(*(MIR_func_t *)paVar105,4);
                      uStack_5e0 = aVar36._0_1_;
                      uStack_5df = aVar36._1_1_;
                      uStack_5de = aVar36._2_6_;
                      aStack_5d8.reg = SUB84(paVar105[2],0);
                      aStack_5d8.mem.alias = SUB84(paVar105[2],4);
                      local_4f8 = (anon_union_8_10_166bea1d_for_u)paVar105->func;
                      aVar36 = paVar105[1];
                      pMStack_4e0 = paVar105[3].func;
                      pMStack_4d8 = paVar105[4].func;
                      pMStack_4d0 = paVar105[5].func;
                      cStack_4f0 = aVar36._0_1_;
                      uStack_4ef = aVar36._1_1_;
                      uStack_4ee = aVar36._2_6_;
                      MStack_4e8 = SUB84(paVar105[2],0);
                      uStack_4e4 = SUB84(paVar105[2],4);
                      pMVar88 = (MIR_context_t)pVVar24->varr;
                      if (pMVar88 == (MIR_context_t)0x0) goto LAB_0013706d;
                      uVar98 = pVVar24->els_num + 1;
                      if (pVVar24->size < uVar98) {
                        sVar91 = (uVar98 >> 1) + uVar98;
                        pMVar69 = (MIR_op_t *)realloc(pMVar88,sVar91 * 0x30);
                        pVVar24->varr = pMVar69;
                        pVVar24->size = sVar91;
                      }
                      sVar91 = pVVar24->els_num;
                      pMVar69 = pVVar24->varr;
                      pVVar24->els_num = sVar91 + 1;
                      auVar6[8] = cStack_4f0;
                      auVar6._0_8_ = local_4f8.func;
                      auVar6[9] = uStack_4ef;
                      auVar6._10_6_ = uStack_4ee;
                      auVar6._16_4_ = MStack_4e8;
                      auVar6._20_4_ = uStack_4e4;
                      auVar6._24_8_ = pMStack_4e0;
                      aVar51.mem.alias = uStack_4e4;
                      aVar51.reg = MStack_4e8;
                      aVar51.str.s = (char *)pMStack_4e0;
                      aVar51._16_8_ = pMStack_4d8;
                      aVar51.mem.disp = (MIR_disp_t)pMStack_4d0;
                      pMVar69[sVar91].u = aVar51;
                      *(undefined1 (*) [32])(pMVar69 + sVar91) = auVar6;
                      MVar96 = (&pHVar25->els_num)[(long)unaff_RBP];
                      switch(MVar96) {
                      case MIR_T_I8:
                        MVar102 = MIR_EXT8;
                        break;
                      case MIR_T_U8:
                        MVar102 = MIR_UEXT8;
                        break;
                      case MIR_T_I16:
                        MVar102 = MIR_EXT16;
                        break;
                      case MIR_T_U16:
                        MVar102 = MIR_UEXT16;
                        break;
                      case MIR_T_I32:
                        MVar102 = MIR_EXT32;
                        break;
                      case MIR_T_U32:
                        MVar102 = MIR_UEXT32;
                        break;
                      default:
                        MVar102 = MIR_INVALID_INSN;
                        bVar56 = true;
                        goto LAB_00134e57;
                      }
                      bVar56 = false;
LAB_00134e57:
                      if (!bVar56) {
                        type = (uint)(MVar96 == MIR_T_LD) * 4 + MIR_T_I64;
                        if ((MVar96 & ~MIR_T_U8) == MIR_T_F) {
                          type = MVar96;
                        }
                        aStack_5d8.reg = new_temp_reg(ctx,type,(MIR_func_t)unaff_R14);
                        uVar82 = ((uint)local_670 & 0xffffff00) + 1;
                        local_608._32_4_ = 0;
                        uStack_5e4 = 0;
                        local_670 = (ulong)uVar82;
                        uStack_5e0 = (undefined1)uVar82;
                        uStack_5df = (undefined1)(uVar82 >> 8);
                        in_stack_fffffffffffff8f0 = (int)CONCAT62(uStack_5de,(short)uVar82);
                        pMVar73 = MIR_new_insn(ctx,MVar102);
                        pMVar88 = ctx;
                        MIR_insert_insn_before(ctx,unaff_R13,pMVar81,pMVar73);
                        auVar7._4_4_ = uStack_5e4;
                        auVar7._0_4_ = local_608._32_4_;
                        auVar7[8] = uStack_5e0;
                        auVar7[9] = uStack_5df;
                        auVar7._10_6_ = uStack_5de;
                        auVar7._16_4_ = aStack_5d8.reg;
                        auVar7._20_4_ = aStack_5d8.mem.alias;
                        auVar7._24_8_ = aStack_5d8.str.s;
                        aVar38.mem.alias = aStack_5d8.mem.alias;
                        aVar38.reg = aStack_5d8.reg;
                        aVar38.str.s = aStack_5d8.str.s;
                        aVar38.mem.base = aStack_5d8.mem.base;
                        aVar38.mem.index = aStack_5d8.mem.index;
                        aVar38.mem.disp = aStack_5d8.mem.disp;
                        *(anon_union_32_12_57d33f68_for_u *)(paVar105 + 2) = aVar38;
                        *(undefined1 (*) [32])paVar105 = auVar7;
                      }
                      unaff_RBP = (MIR_context_t)((long)&unaff_RBP->gen_ctx + 1);
                      paVar105 = paVar105 + 6;
                    } while (unaff_RBP < (MIR_context_t)(ulong)*(uint *)&unaff_R14->temp_data);
                  }
                  if (pVVar92->els_num != 0) {
                    uVar98 = 0;
                    do {
                      if (pVVar92->varr == (MIR_insn_t_conflict *)0x0) goto LAB_00137075;
                      pMVar73 = pVVar92->varr[uVar98];
                      if (pMVar73 != pMVar81) {
                        if ((int)*(undefined8 *)&pMVar73->field_0x18 != 0xab) {
                          if (pMVar73 == (MIR_insn_t_conflict)0x0) {
LAB_001370a1:
                            __assert_fail("insn != ((void*)0)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                          ,0x816,"size_t MIR_insn_nops(MIR_context_t, MIR_insn_t)");
                          }
                          if ((int)((ulong)*(undefined8 *)&pMVar73->field_0x18 >> 0x20) !=
                              *(int *)&unaff_R14->temp_data) {
                            __assert_fail("insn->code == MIR_RET || func->nres == MIR_insn_nops (ctx, insn)"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                          ,0xde6,"void make_one_ret(MIR_context_t, MIR_item_t)");
                          }
                        }
                        if (*(int *)&unaff_R14->temp_data != 0) {
                          lVar104 = 0x20;
                          uVar72 = 0;
                          do {
                            hVar17 = (&pHVar25->els_num)[uVar72];
                            if (hVar17 == 8) {
                              MVar102 = MIR_FMOV;
                            }
                            else if (hVar17 == 9) {
                              MVar102 = MIR_DMOV;
                            }
                            else {
                              MVar102 = (uint)(hVar17 == 10) * 3;
                            }
                            paVar105 = (anon_union_8_10_166bea1d_for_u *)
                                       ((long)pMVar73->ops + lVar104 + -0x20);
                            local_4f8 = *paVar105;
                            aVar36 = paVar105[1];
                            puVar2 = (undefined8 *)((long)pMVar73->ops + lVar104 + -0x10);
                            pMStack_4e0 = (MIR_func_t)puVar2[1];
                            pMStack_4d8 = (MIR_func_t)puVar2[2];
                            pMStack_4d0 = (MIR_func_t)puVar2[3];
                            cStack_4f0 = aVar36._0_1_;
                            uStack_4ef = aVar36._1_1_;
                            uStack_4ee = aVar36._2_6_;
                            MStack_4e8 = (MIR_reg_t)*puVar2;
                            uStack_4e4 = (undefined4)((ulong)*puVar2 >> 0x20);
                            if (cStack_4f0 != '\x01') goto LAB_00136ff3;
                            pMVar69 = pVVar24->varr;
                            if ((pMVar69 == (MIR_op_t *)0x0) || (pVVar24->els_num <= uVar72)) {
                              MIR_link_cold_28();
                              goto LAB_00136fee;
                            }
                            puVar2 = (undefined8 *)((long)pMVar69 + lVar104 + -0x20);
                            uVar37 = puVar2[1];
                            aStack_5d8.str.s = (char *)puVar2[3];
                            uVar26 = *(undefined8 *)((long)&pMVar69->data + lVar104);
                            aStack_5d8.mem.base = (MIR_reg_t)uVar26;
                            aStack_5d8.mem.index = (MIR_reg_t)((ulong)uVar26 >> 0x20);
                            aStack_5d8.mem.disp = *(undefined8 *)(&pMVar69->field_0x8 + lVar104);
                            local_608._32_4_ = (undefined4)*puVar2;
                            uStack_5e4 = (undefined4)((ulong)*puVar2 >> 0x20);
                            uStack_5e0 = (undefined1)uVar37;
                            uStack_5df = (undefined1)((ulong)uVar37 >> 8);
                            uStack_5de = (undefined6)((ulong)uVar37 >> 0x10);
                            aStack_5d8.reg = (MIR_reg_t)puVar2[2];
                            aStack_5d8.mem.alias = (MIR_alias_t)((ulong)puVar2[2] >> 0x20);
                            pMVar80 = MIR_new_insn(ctx,MVar102);
                            MIR_insert_insn_before(ctx,unaff_R13,pMVar73,pMVar80);
                            uVar72 = uVar72 + 1;
                            lVar104 = lVar104 + 0x30;
                          } while (uVar72 < *(uint *)&unaff_R14->temp_data);
                        }
                        uStack_520 = 0xc;
                        local_528 = (MIR_item_t)0x0;
                        MStack_518 = (MIR_reg_t)local_660;
                        uStack_514 = (undefined4)((ulong)local_660 >> 0x20);
                        auVar40._9_7_ = uStack_51f;
                        auVar40._0_9_ = (unkuint9)0xc << 0x40;
                        in_stack_fffffffffffff8f0 = auVar40._8_4_;
                        pMVar80 = MIR_new_insn(ctx,MIR_JMP);
                        MIR_insert_insn_before(ctx,unaff_R13,pMVar73,pMVar80);
                        pMVar88 = ctx;
                        remove_insn(ctx,unaff_R13,pMVar73,&((unaff_R13->u).func)->insns);
                      }
                      uVar98 = uVar98 + 1;
                    } while (uVar98 < pVVar92->els_num);
                  }
                }
                for (pMVar94 = pMVar28->first_lref; pMVar94 != (MIR_lref_data *)0x0;
                    pMVar94 = pMVar94->next) {
                  pMVar88 = ctx;
                  mark_used_label(ctx,pMVar94->label);
                  if (pMVar94->label2 != (MIR_label_t)0x0) {
                    pMVar88 = ctx;
                    mark_used_label(ctx,pMVar94->label2);
                  }
                }
                psVar70 = ctx->simplify_ctx;
                pVVar92 = psVar70->labels;
                unaff_RBP = ctx;
                if (pVVar92 != (VARR_MIR_insn_t *)0x0) {
                  uVar98 = 0;
                  while (ppMVar76 = pVVar92->varr, uVar98 < pVVar92->els_num) {
                    if (ppMVar76 == (MIR_insn_t_conflict *)0x0) goto LAB_0013704b;
                    pVVar20 = ctx->used_label_p;
                    if (pVVar20 == (VARR_uint8_t *)0x0) goto LAB_00137053;
                    pMVar81 = ppMVar76[uVar98];
                    pMVar99 = (MIR_context_t)pMVar81->ops[0].u.ref;
                    pMVar88 = (MIR_context_t)pVVar20->els_num;
                    if ((long)pMVar99 < (long)pMVar88) {
                      if ((pVVar20->varr == (uint8_t *)0x0) || (pMVar88 <= pMVar99))
                      goto LAB_00137060;
                      if (pVVar20->varr[(long)pMVar99] == '\0') goto LAB_00135271;
                      pMVar71 = (MIR_item_t)psVar70->new_label_num;
                      psVar70->new_label_num = (size_t)((long)&pMVar71->data + 1);
                      uVar82 = (uint)unaff_RBP & 0xffffff00 | 3;
                      unaff_RBP = (MIR_context_t)(ulong)uVar82;
                      pMVar81->ops[0].data = (void *)0x0;
                      *(short *)&pMVar81->ops[0].field_0x8 = (short)uVar82;
                      pMVar81->ops[0].u.ref = pMVar71;
                    }
                    else {
LAB_00135271:
                      pMVar88 = ctx;
                      remove_insn(ctx,unaff_R13,pMVar81,&((unaff_R13->u).func)->insns);
                    }
                    uVar98 = uVar98 + 1;
                    psVar70 = ctx->simplify_ctx;
                    pVVar92 = psVar70->labels;
                    unaff_R14 = ctx;
                    if (pVVar92 == (VARR_MIR_insn_t *)0x0) goto LAB_0013703e;
                  }
                  if (ppMVar76 != (MIR_insn_t_conflict *)0x0) {
                    pVVar92->els_num = 0;
                    uVar61 = uStack_5e0;
                    uVar62 = uStack_5df;
                    uVar63 = uStack_5de;
                    if (!bVar106) {
                      unaff_R13->data = (void *)0x1;
                    }
                    goto switchD_00133eac_caseD_1;
                  }
                  goto LAB_00137209;
                }
                goto LAB_0013703e;
              }
              MIR_link_cold_38();
            }
            MIR_link_cold_39();
            goto LAB_0013713c;
          }
          (*ctx->error_func)(MIR_wrong_param_value_error,"MIR_remove_simplify: wrong func item");
LAB_00137201:
          MIR_link_cold_37();
          unaff_RBP = ctx;
LAB_00137209:
          MIR_link_cold_32();
LAB_00137211:
          unaff_R14 = (MIR_context_t)(unaff_R13->u).func;
          pcVar100 = "import of undefined item %s";
          goto LAB_0013721c;
        default:
          goto switchD_00133eac_caseD_1;
        case MIR_import_item:
          local_4f8 = unaff_R13->u;
          aStack_5d8.mem.base = 0;
          uStack_5e0 = SUB81(pMVar1,0);
          uVar61 = uStack_5e0;
          uStack_5df = (undefined1)((ulong)pMVar1 >> 8);
          uVar62 = uStack_5df;
          uStack_5de = (undefined6)((ulong)pMVar1 >> 0x10);
          uVar63 = uStack_5de;
          local_5a8 = &local_4f8;
          pMVar88 = (MIR_context_t)ctx->module_item_tab;
          iVar64 = HTAB_MIR_item_t_do((HTAB_MIR_item_t *)pMVar88,
                                      (MIR_item_t_conflict)(local_608 + 0x20),HTAB_FIND,&local_528);
          pMVar71 = local_528;
          if (iVar64 == 0) {
            pMVar71 = (MIR_item_t)0x0;
          }
          if (pMVar71 == (MIR_item_t)0x0) {
            unaff_RBP = ctx;
            if ((import_resolver == (_func_void_ptr_char_ptr *)0x0) ||
               (addr = (*import_resolver)((unaff_R13->u).import_id), addr == (void *)0x0))
            goto LAB_00137211;
            MIR_load_external(ctx,(unaff_R13->u).import_id,addr);
            local_4f8 = unaff_R13->u;
            aStack_5d8.mem.base = 0;
            local_5a8 = &local_4f8;
            pMVar88 = (MIR_context_t)ctx->module_item_tab;
            uStack_5e0 = uVar61;
            uStack_5df = uVar62;
            uStack_5de = uVar63;
            iVar64 = HTAB_MIR_item_t_do((HTAB_MIR_item_t *)pMVar88,
                                        (MIR_item_t_conflict)(local_608 + 0x20),HTAB_FIND,&local_528
                                       );
            pMVar71 = local_528;
            if (iVar64 == 0) {
              pMVar71 = (MIR_item_t)0x0;
            }
            if (pMVar71 == (MIR_item_t)0x0) {
              __assert_fail("tab_item != ((void*)0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0x7ba,
                            "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                           );
            }
          }
          break;
        case MIR_export_item:
          local_4f8 = unaff_R13->u;
          aStack_5d8.mem.base = 0;
          local_5a8 = &local_4f8;
          pMVar88 = (MIR_context_t)ctx->module_item_tab;
          iVar64 = HTAB_MIR_item_t_do((HTAB_MIR_item_t *)pMVar88,
                                      (MIR_item_t_conflict)(local_608 + 0x20),HTAB_FIND,&local_528);
          if ((iVar64 == 0) || (pMVar71 = local_528, local_528 == (MIR_item_t)0x0))
          goto LAB_001371b1;
          break;
        case MIR_forward_item:
          local_4f8 = unaff_R13->u;
          aStack_5d8.mem.base = 0;
          local_5a8 = &local_4f8;
          pMVar88 = (MIR_context_t)ctx->module_item_tab;
          iVar64 = HTAB_MIR_item_t_do((HTAB_MIR_item_t *)pMVar88,
                                      (MIR_item_t_conflict)(local_608 + 0x20),HTAB_FIND,&local_528);
          if ((iVar64 == 0) || (pMVar71 = local_528, local_528 == (MIR_item_t)0x0)) {
            unaff_R14 = (MIR_context_t)(unaff_R13->u).func;
            pcVar100 = "forward of undefined item %s";
            unaff_RBP = ctx;
            goto LAB_0013721c;
          }
        }
        unaff_R13->addr = pMVar71->addr;
        unaff_R13->ref_def = pMVar71;
        uVar61 = uStack_5e0;
        uVar62 = uStack_5df;
        uVar63 = uStack_5de;
switchD_00133eac_caseD_1:
        uStack_5de = uVar63;
        uStack_5df = uVar62;
        uStack_5e0 = uVar61;
      }
      pMVar99 = (MIR_context_t)((long)&local_560->gen_ctx + 1);
      pVVar68 = ctx->modules_to_link;
      unaff_RBP = ctx;
    } while (pVVar68 != (VARR_MIR_module_t *)0x0);
  }
  MIR_link_cold_42();
LAB_00135322:
  pVVar68 = unaff_RBP->modules_to_link;
  if (pVVar68 != (VARR_MIR_module_t *)0x0) {
    unaff_R14 = (MIR_context_t)0x0;
    do {
      if ((MIR_context_t)pVVar68->els_num <= unaff_R14) goto LAB_00136f61;
      if (pVVar68->varr == (MIR_module_t_conflict *)0x0) {
LAB_001372cc:
        MIR_link_cold_22();
LAB_001372d4:
        __assert_fail("called_func->nres == actual_nops",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x1028,"void process_inlines(MIR_context_t, MIR_item_t)");
      }
      pMVar21 = unaff_R14;
      pMVar99 = local_560;
      for (pMVar27 = (MIR_insn_t)(pVVar68->varr[(long)unaff_R14]->items).head; local_560 = pMVar21,
          pMVar27 != (MIR_insn_t)0x0; pMVar27 = *(MIR_insn_t *)&pMVar27->field_0x18) {
        MVar18 = *(MIR_item_type_t *)&pMVar27->ops[0].data;
        if (MVar18 == MIR_ref_data_item) {
          pMVar29 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar27->ops[0].u + 0x10))->lref_data
          ;
          pMVar71 = pMVar29->label->ops[0].u.ref;
          if (pMVar71 == (MIR_item_t)0x0) {
LAB_0013713c:
            __assert_fail("item->u.ref_data->ref_item->addr != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x7d8,
                          "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                         );
          }
          pMVar29->orig_label->data =
               (void *)((long)&pMVar29->label2->ops[0].data + (long)&pMVar71[-1].ref_def);
          pMVar99 = pMVar88;
        }
        else {
          if ((MVar18 == MIR_func_item) && (pMVar27->data != (void *)0x0)) {
            if (*(MIR_item_type_t *)&pMVar27->ops[0].data != MIR_func_item) {
              __assert_fail("func_item->item_type == MIR_func_item",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0xf9d,"void process_inlines(MIR_context_t, MIR_item_t)");
            }
            HTAB_val_t_clear(unaff_RBP->simplify_ctx->val_tab);
            pMVar28 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar27->ops[0].u + 0x10))->func;
            local_678 = 0;
            for (pMVar81 = (pMVar28->insns).head; pMVar81 != (MIR_insn_t_conflict)0x0;
                pMVar81 = (pMVar81->insn_link).next) {
              local_678 = local_678 + 1;
            }
            pMVar88 = unaff_RBP;
            local_630 = func_alloca_features
                                  (unaff_RBP,pMVar28,&local_614,(int *)0x0,(int64_t *)local_608);
            if (local_614 != 0 && local_630 == (MIR_insn_t_conflict)0x0) {
LAB_00137166:
              __assert_fail("func_top_alloca != ((void*)0) || !func_top_alloca_used_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0xfa2,"void process_inlines(MIR_context_t, MIR_item_t)");
            }
            if (local_630 == (MIR_insn_t_conflict)0x0 || local_614 == 0) {
              local_570 = (MIR_context_t)0x0;
              local_648 = (MIR_context_t)0x0;
            }
            else {
              pMVar99 = (MIR_context_t)&DAT_00000001;
              if (1 < (long)local_608._0_8_) {
                pMVar99 = (MIR_context_t)local_608._0_8_;
              }
              local_570 = (MIR_context_t)((ulong)(8 < (long)local_608._0_8_) * 8 + 8);
              if ((long)local_608._0_8_ < 5) {
                local_570 = (MIR_context_t)0x4;
              }
              if ((long)local_608._0_8_ < 3) {
                local_570 = pMVar99;
              }
              puVar4 = (undefined1 *)((long)&pMVar99[-1].wrapper_end_addr + 7) + (long)local_570;
              local_648 = (MIR_context_t)(puVar4 + -((long)puVar4 % (long)local_570));
            }
            psVar70 = unaff_RBP->simplify_ctx;
            pVVar92 = psVar70->anchors;
            if ((pVVar92 == (VARR_MIR_insn_t *)0x0) || (pVVar92->varr == (MIR_insn_t_conflict *)0x0)
               ) {
LAB_00137109:
              MIR_link_cold_21();
            }
            else {
              pVVar92->els_num = 0;
              pVVar30 = psVar70->alloca_sizes;
              if ((pVVar30 == (VARR_size_t *)0x0) || (pVVar30->varr == (size_t *)0x0)) {
                MIR_link_cold_20();
                goto LAB_00137109;
              }
              pVVar30->els_num = 0;
              pVVar92 = psVar70->cold_insns;
              if ((pVVar92 != (VARR_MIR_insn_t *)0x0) &&
                 (pVVar92->varr != (MIR_insn_t_conflict *)0x0)) {
                pVVar92->els_num = 0;
                local_628 = (pMVar28->insns).head;
                if (local_628 == (MIR_insn_t_conflict)0x0) {
                  local_620 = local_648;
                }
                else {
                  local_3d0 = (local_678 * 0x32) / 100;
                  if (local_3d0 < 0xc9) {
                    local_3d0 = 200;
                  }
                  local_620 = local_648;
                  local_638 = (MIR_insn_t_conflict)0x0;
                  local_618 = (uint)local_648;
                  unaff_R14 = local_648;
                  pMVar81 = local_628;
                  local_608._16_4_ = local_618;
                  local_608._20_4_ = local_618;
                  do {
                    psVar70 = unaff_RBP->simplify_ctx;
                    psVar70->inline_insns_before = psVar70->inline_insns_before + 1;
                    psVar70->inline_insns_after = psVar70->inline_insns_after + 1;
                    pVVar92 = psVar70->anchors;
                    if (pVVar92 == (VARR_MIR_insn_t *)0x0) goto LAB_0013705b;
                    sVar91 = pVVar92->els_num;
                    if (sVar91 != 0) {
                      ppMVar76 = pVVar92->varr;
                      if (ppMVar76 == (MIR_insn_t_conflict *)0x0) goto LAB_00137068;
                      if (ppMVar76[sVar91 - 1] == pMVar81) {
                        pMVar88 = (MIR_context_t)psVar70->alloca_sizes;
                        sVar91 = sVar91 - 1;
                        do {
                          pVVar92->els_num = sVar91;
                          if (((pMVar88 == (MIR_context_t)0x0) ||
                              (pMVar88->error_func == (MIR_error_func_t)0x0)) ||
                             (pgVar31 = pMVar88->gen_ctx, pgVar31 == (gen_ctx *)0x0)) {
LAB_00136fee:
                            MIR_link_cold_3();
LAB_00136ff3:
                            __assert_fail("reg_op.mode == MIR_OP_REG",
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                          ,0xdea,"void make_one_ret(MIR_context_t, MIR_item_t)");
                          }
                          pMVar88->gen_ctx = (gen_ctx *)((long)&pgVar31[-1].spot_attrs + 7);
                          unaff_R14 = *(MIR_context_t *)
                                       (pMVar88->error_func + (long)pgVar31 * 8 + -8);
                          bVar106 = sVar91 != 0;
                          sVar91 = sVar91 - 1;
                        } while ((bVar106) && (ppMVar76[sVar91] == pMVar81));
                      }
                    }
                    pMVar73 = (pMVar81->insn_link).next;
                    if (*(int *)&pMVar81->field_0x18 == 0xb4) {
                      pMVar71 = (MIR_item_t)psVar70->new_label_num;
                      psVar70->new_label_num = (size_t)((long)&pMVar71->data + 1);
                      pMVar81->ops[0].u.ref = pMVar71;
                    }
                    MVar102 = (MIR_insn_code_t)*(undefined8 *)&pMVar81->field_0x18;
                    if (0xfffffffc < MVar102 - MIR_SWITCH) {
                      pMVar88 = unaff_RBP;
                      if ((*(char *)&pMVar81[1].insn_link.prev == '\b') &&
                         (pMVar87 = pMVar81[1].insn_link.next, pMVar87 != (MIR_insn_t)0x0)) {
LAB_00135671:
                        MVar18 = *(MIR_item_type_t *)&pMVar87->ops[0].data;
                        if (MVar18 - MIR_import_item < 3) goto code_r0x0013567c;
                        if (pMVar87 != pMVar27 && MVar18 == MIR_func_item) {
                          pMVar89 = ((anon_union_8_10_166bea1d_for_u *)
                                    ((long)&pMVar87->ops[0].u + 0x10))->func;
                          uVar98 = 0;
                          for (pMVar80 = (pMVar89->insns).head; pMVar80 != (MIR_insn_t_conflict)0x0;
                              pMVar80 = (pMVar80->insn_link).next) {
                            uVar98 = uVar98 + 1;
                          }
                          if (((pMVar89->first_lref != (MIR_lref_data *)0x0) ||
                              (pMVar89->vararg_p != '\0')) || (pMVar89->jret_p != '\0')) {
LAB_00135719:
                            simplify_op(unaff_RBP,(MIR_item_t_conflict)pMVar27,pMVar81,1,0,MVar102,0
                                        ,in_stack_fffffffffffff8f0);
                            goto LAB_001356b5;
                          }
                          uVar72 = 200;
                          if (MVar102 == MIR_CALL) {
                            uVar72 = 0x32;
                          }
                          if ((uVar72 < uVar98) || (local_3d0 < local_678)) goto LAB_00135719;
                          psVar77 = &unaff_RBP->simplify_ctx->inlined_calls;
                          *psVar77 = *psVar77 + 1;
                          local_3f0 = *(int **)(*(long *)((long)&(pMVar81->ops[0].u.label)->ops[0].u
                                                         + 0x10) + 0x10);
                          local_3f8 = (pMVar81->insn_link).prev;
                          pMVar73 = (pMVar81->insn_link).next;
                          local_400 = uVar98;
                          if (pMVar73 == (MIR_insn_t_conflict)0x0) {
                            sVar91 = unaff_RBP->curr_label_num + 1;
                            unaff_RBP->curr_label_num = sVar91;
                            pMVar73 = create_label(unaff_RBP,sVar91);
                            MIR_insert_insn_after
                                      (unaff_RBP,(MIR_item_t_conflict)pMVar27,pMVar81,pMVar73);
                          }
                          pMVar28->n_inlines = pMVar28->n_inlines + 1;
                          pVVar32 = pMVar89->vars;
                          if (pVVar32 == (VARR_MIR_var_t *)0x0) {
LAB_0013736f:
                            MIR_link_cold_13();
LAB_00137374:
                            MIR_link_cold_11();
LAB_00137379:
                            MIR_link_cold_12();
                            return;
                          }
                          rename_regs(unaff_RBP,pMVar28,pMVar89,pVVar32,pVVar32->els_num);
                          pVVar32 = pMVar89->global_vars;
                          if (pVVar32 == (VARR_MIR_var_t *)0x0) {
                            sVar91 = 0;
                          }
                          else {
                            sVar91 = pVVar32->els_num;
                          }
                          rename_regs(unaff_RBP,pMVar28,pMVar89,pVVar32,sVar91);
                          local_578 = (MIR_insn_t_conflict)(ulong)pMVar89->nargs;
                          if (local_578 == (MIR_insn_t_conflict)0x0) {
LAB_00136285:
                            pVVar92 = unaff_RBP->simplify_ctx->anchors;
                            if (pVVar92->varr == (MIR_insn_t_conflict *)0x0) goto LAB_00137379;
                            uVar98 = pVVar92->els_num + 1;
                            if (pVVar92->size < uVar98) {
                              sVar91 = (uVar98 >> 1) + uVar98;
                              ppMVar76 = (MIR_insn_t_conflict *)realloc(pVVar92->varr,sVar91 * 8);
                              pVVar92->varr = ppMVar76;
                              pVVar92->size = sVar91;
                              unaff_RBP = local_680;
                            }
                            sVar91 = pVVar92->els_num;
                            pVVar92->els_num = sVar91 + 1;
                            pVVar92->varr[sVar91] = pMVar73;
                            pVVar30 = unaff_RBP->simplify_ctx->alloca_sizes;
                            if (pVVar30->varr == (size_t *)0x0) goto LAB_00137374;
                            uVar98 = pVVar30->els_num + 1;
                            if (pVVar30->size < uVar98) {
                              sVar91 = (uVar98 >> 1) + uVar98;
                              psVar77 = (size_t *)realloc(pVVar30->varr,sVar91 * 8);
                              pVVar30->varr = psVar77;
                              pVVar30->size = sVar91;
                              unaff_RBP = local_680;
                            }
                            sVar91 = pVVar30->els_num;
                            pVVar30->els_num = sVar91 + 1;
                            pVVar30->varr[sVar91] = (size_t)unaff_R14;
                            pMVar80 = (MIR_insn_t_conflict)local_608;
                            pMVar75 = func_alloca_features
                                                (unaff_RBP,pMVar89,(int *)(local_608 + 0x18),
                                                 (int *)(local_608 + 0x1c),(int64_t *)pMVar80);
                            pVVar92 = extraout_RDX_01;
                            if ((pMVar75 != (MIR_insn_t_conflict)0x0) && (local_608._24_4_ != 0)) {
                              pMVar88 = (MIR_context_t)&DAT_00000001;
                              if (1 < (long)local_608._0_8_) {
                                pMVar88 = (MIR_context_t)local_608._0_8_;
                              }
                              pMVar99 = (MIR_context_t)((ulong)(8 < (long)local_608._0_8_) * 8 + 8);
                              if ((long)local_608._0_8_ < 5) {
                                pMVar99 = (MIR_context_t)0x4;
                              }
                              if ((long)local_608._0_8_ < 3) {
                                pMVar99 = pMVar88;
                              }
                              puVar4 = (undefined1 *)((long)&pMVar88[-1].wrapper_end_addr + 7) +
                                       (long)pMVar99;
                              pVVar92 = (VARR_MIR_insn_t *)((long)puVar4 % (long)pMVar99);
                              local_608._0_8_ = puVar4 + -(long)pVVar92;
                              if ((long)local_570 < (long)pMVar99) {
                                puVar4 = (undefined1 *)((long)&pMVar99[-1].wrapper_end_addr + 7) +
                                         (long)unaff_R14;
                                pVVar92 = (VARR_MIR_insn_t *)((long)puVar4 % (long)pMVar99);
                                unaff_R14 = (MIR_context_t)(puVar4 + -(long)pVVar92);
                                local_570 = pMVar99;
                              }
                              unaff_R14 = (MIR_context_t)
                                          ((long)&((MIR_context_t)local_608._0_8_)->gen_ctx +
                                          (long)&unaff_R14->gen_ctx);
                              if ((long)local_620 <= (long)unaff_R14) {
                                local_620 = unaff_R14;
                              }
                            }
                            psVar70 = unaff_RBP->simplify_ctx;
                            pVVar35 = psVar70->temp_insns;
                            if ((pVVar35 == (VARR_MIR_insn_t *)0x0) ||
                               (pVVar35->varr == (MIR_insn_t_conflict *)0x0)) {
                              MIR_link_cold_10();
LAB_00137365:
                              MIR_link_cold_8();
LAB_0013736a:
                              MIR_link_cold_9();
                              goto LAB_0013736f;
                            }
                            pVVar35->els_num = 0;
                            pVVar35 = psVar70->labels;
                            if ((pVVar35 == (VARR_MIR_insn_t *)0x0) ||
                               (pVVar35->varr == (MIR_insn_t_conflict *)0x0)) goto LAB_0013736a;
                            pVVar35->els_num = 0;
                            pVVar20 = unaff_RBP->temp_data;
                            if ((pVVar20 == (VARR_uint8_t *)0x0) ||
                               (pVVar20->varr == (uint8_t *)0x0)) goto LAB_00137365;
                            pVVar20->els_num = 0;
                            if (local_608._28_4_ != 0) {
                              pMVar78 = (MIR_insn_t_conflict)0x0;
LAB_00136585:
                              pMVar79 = (pMVar89->insns).head;
                              if (pMVar79 != pMVar78) {
                                do {
                                  local_610 = pMVar78;
                                  if (*(int *)&pMVar79->field_0x18 == 0xac) goto LAB_00137262;
                                  psVar77 = &unaff_RBP->simplify_ctx->inline_insns_after;
                                  *psVar77 = *psVar77 + 1;
                                  pMVar78 = MIR_copy_insn(unaff_RBP,pMVar79);
                                  if (pMVar79 == pMVar75) {
                                    local_638 = pMVar78;
                                  }
                                  change_inline_insn_regs(unaff_RBP,pMVar78);
                                  if (*(int *)&pMVar78->field_0x18 == 0xab) {
                                    if (pMVar79 == (MIR_insn_t_conflict)0x0) goto LAB_001370a1;
                                    if ((((pMVar79->insn_link).next != local_610) ||
                                        (pMVar81->ops[0].field_0x8 != '\b')) ||
                                       ((pMVar81->ops[0].u.ref)->item_type != MIR_proto_item))
                                    goto LAB_00137226;
                                    uVar98 = *(ulong *)&pMVar79->field_0x18 >> 0x20;
                                    local_578 = pMVar79;
                                    if ((uint32_t)(*(ulong *)&pMVar79->field_0x18 >> 0x20) !=
                                        pMVar89->nres) goto LAB_001372d4;
                                    if (uVar98 != 0) {
                                      lVar104 = 0;
                                      piVar95 = local_3f0;
                                      do {
                                        if ((&pMVar78->ops[0].field_0x8)[lVar104] != '\x01') {
                                          __assert_fail("ret_insn->ops[i].mode == MIR_OP_REG",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                                  ,0x102b,
                                                  "void process_inlines(MIR_context_t, MIR_item_t)")
                                          ;
                                        }
                                        iVar64 = *piVar95;
                                        if (iVar64 == 8) {
                                          MVar102 = MIR_FMOV;
                                        }
                                        else if (iVar64 == 9) {
                                          MVar102 = MIR_DMOV;
                                        }
                                        else {
                                          MVar102 = (uint)(iVar64 == 10) * 3;
                                        }
                                        uStack_178 = *(undefined4 *)
                                                      ((long)&pMVar78->ops[0].u + lVar104);
                                        uStack_180 = 1;
                                        local_188 = 0;
                                        in_stack_fffffffffffff8f0 =
                                             SUB324(*(undefined1 (*) [32])
                                                     ((long)&pMVar81[1].ops[0].u + lVar104),8);
                                        pMVar79 = MIR_new_insn(local_680,MVar102);
                                        MIR_insert_insn_before
                                                  (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,
                                                   pMVar79);
                                        lVar104 = lVar104 + 0x30;
                                        piVar95 = piVar95 + 1;
                                      } while (uVar98 * 0x30 != lVar104);
                                    }
                                    free(pMVar78);
                                    pVVar92 = extraout_RDX_02;
                                    unaff_RBP = local_680;
                                    pMVar79 = local_578;
                                  }
                                  else {
                                    MIR_insert_insn_before
                                              (unaff_RBP,(MIR_item_t_conflict)pMVar27,pMVar73,
                                               pMVar78);
                                    store_labels_for_duplication
                                              ((MIR_context_t)unaff_RBP->simplify_ctx->labels,
                                               unaff_RBP->simplify_ctx->temp_insns,
                                               (VARR_MIR_insn_t *)pMVar79,pMVar78,pMVar80);
                                    pVVar92 = extraout_RDX_03;
                                  }
                                  pMVar79 = (pMVar79->insn_link).next;
                                  pMVar78 = local_610;
                                } while (pMVar79 != local_610);
                              }
                              redirect_duplicated_labels
                                        ((MIR_context_t)unaff_RBP->simplify_ctx->labels,
                                         unaff_RBP->simplify_ctx->temp_insns,pVVar92);
                              if (local_608._28_4_ != 0) {
                                MVar67 = new_temp_reg(unaff_RBP,MIR_T_I64,pMVar28);
                                uStack_1b0 = 1;
                                local_1b8 = 0;
                                MStack_1a8 = MVar67;
                                pMVar80 = MIR_new_insn(unaff_RBP,MIR_BSTART);
                                MIR_insert_insn_after
                                          (unaff_RBP,(MIR_item_t_conflict)pMVar27,pMVar81,pMVar80);
                                uStack_1e0 = 1;
                                local_1e8 = 0;
                                auVar53._9_7_ = uStack_1df;
                                auVar53._0_9_ = (unkuint9)1 << 0x40;
                                in_stack_fffffffffffff8f0 = auVar53._8_4_;
                                MStack_1d8 = MVar67;
                                pMVar80 = MIR_new_insn(unaff_RBP,MIR_BEND);
                                MIR_insert_insn_before
                                          (unaff_RBP,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar80);
                              }
                              if (pMVar75 != (MIR_insn_t_conflict)0x0) {
                                if (local_608._24_4_ != 0) {
                                  local_614 = 1;
                                  if (local_630 == (MIR_insn_t_conflict)0x0) {
                                    MVar67 = new_temp_reg(unaff_RBP,MIR_T_I64,pMVar28);
                                    uStack_210 = 1;
                                    local_218 = 0;
                                    MStack_208 = MVar67;
                                    local_630 = MIR_new_insn(unaff_RBP,MIR_ALLOCA);
                                    if (*(int *)&local_628->field_0x18 == 0xb4) {
                                      MIR_insert_insn_after
                                                (unaff_RBP,(MIR_item_t_conflict)pMVar27,local_628,
                                                 local_630);
                                    }
                                    else {
                                      MIR_insert_insn_before
                                                (unaff_RBP,(MIR_item_t_conflict)pMVar27,local_628,
                                                 local_630);
                                    }
                                    uStack_240 = 1;
                                    local_248 = 0;
                                    uStack_270 = 3;
                                    local_278 = 0;
                                    uStack_268 = 0;
                                    MStack_238 = MVar67;
                                    pMVar73 = MIR_new_insn(unaff_RBP,MIR_MOV);
                                    MIR_insert_insn_before
                                              (unaff_RBP,(MIR_item_t_conflict)pMVar27,local_630,
                                               pMVar73);
                                    local_648 = (MIR_context_t)0x0;
                                  }
                                  if (unaff_R14 == (MIR_context_t)local_608._0_8_) {
                                    auVar107 = *(undefined1 (*) [32])local_638->ops;
                                  }
                                  else {
                                    MVar67 = new_temp_reg(unaff_RBP,MIR_T_I64,pMVar28);
                                    uStack_2a0 = 1;
                                    local_2a8 = 0;
                                    MStack_298 = MVar67;
                                    pMVar73 = MIR_new_insn(unaff_RBP,MIR_ADD);
                                    MIR_insert_insn_after
                                              (unaff_RBP,(MIR_item_t_conflict)pMVar27,pMVar81,
                                               pMVar73);
                                    uStack_2d0 = 1;
                                    local_2d8 = 0;
                                    lStack_2f8 = (long)unaff_R14 - local_608._0_8_;
                                    uStack_300 = 3;
                                    local_308 = 0;
                                    auVar107._9_7_ = uStack_2cf;
                                    auVar107._0_9_ = (unkuint9)1 << 0x40;
                                    auVar107._16_4_ = MVar67;
                                    auVar107._20_12_ = auStack_2c4;
                                    MStack_2c8 = MVar67;
                                  }
                                  in_stack_fffffffffffff8f0 = auVar107._8_4_;
                                  pMVar73 = MIR_new_insn(unaff_RBP,MIR_MOV);
                                  MIR_insert_insn_after
                                            (unaff_RBP,(MIR_item_t_conflict)pMVar27,pMVar81,pMVar73)
                                  ;
                                }
                                if (local_628 == local_638) {
                                  local_628 = (local_628->insn_link).next;
                                }
                                remove_insn(unaff_RBP,(MIR_item_t_conflict)pMVar27,local_638,
                                            &((anon_union_8_10_166bea1d_for_u *)
                                             ((long)&pMVar27->ops[0].u + 0x10))->func->insns);
                              }
                              if (local_628 == pMVar81) {
                                local_628 = (local_628->insn_link).next;
                              }
                              pMVar88 = unaff_RBP;
                              remove_insn(unaff_RBP,(MIR_item_t_conflict)pMVar27,pMVar81,
                                          &((anon_union_8_10_166bea1d_for_u *)
                                           ((long)&pMVar27->ops[0].u + 0x10))->func->insns);
                              if (local_628 == pMVar81) {
                                local_628 = (pMVar28->insns).head;
                              }
                              local_678 = local_678 + local_400;
                              if (local_3f8 == (MIR_insn_t)0x0) {
                                pMVar73 = (pMVar28->insns).head;
                              }
                              else {
                                pMVar73 = (local_3f8->insn_link).next;
                              }
                              goto LAB_001356b5;
                            }
                            pMVar78 = (pMVar89->insns).tail;
                            while( true ) {
                              if (pMVar78 == (MIR_insn_t_conflict)0x0) {
                                __assert_fail("insn != ((void*)0)",
                                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                              ,0x1015,
                                              "void process_inlines(MIR_context_t, MIR_item_t)");
                              }
                              if (*(int *)&pMVar78->field_0x18 - 0xabU < 2) {
                                pMVar78 = (pMVar78->insn_link).next;
                                goto LAB_00136585;
                              }
                              psVar77 = &unaff_RBP->simplify_ctx->inline_insns_after;
                              *psVar77 = *psVar77 + 1;
                              pMVar79 = MIR_copy_insn(unaff_RBP,pMVar78);
                              change_inline_insn_regs(unaff_RBP,pMVar79);
                              store_labels_for_duplication
                                        ((MIR_context_t)unaff_RBP->simplify_ctx->labels,
                                         unaff_RBP->simplify_ctx->temp_insns,
                                         (VARR_MIR_insn_t *)pMVar78,pMVar79,pMVar80);
                              pVVar35 = unaff_RBP->simplify_ctx->cold_insns;
                              if (pVVar35->varr == (MIR_insn_t_conflict *)0x0) break;
                              uVar98 = pVVar35->els_num + 1;
                              if (pVVar35->size < uVar98) {
                                sVar91 = (uVar98 >> 1) + uVar98;
                                ppMVar76 = (MIR_insn_t_conflict *)realloc(pVVar35->varr,sVar91 * 8);
                                pVVar35->varr = ppMVar76;
                                pVVar35->size = sVar91;
                              }
                              sVar91 = pVVar35->els_num;
                              pVVar92 = (VARR_MIR_insn_t *)(sVar91 + 1);
                              pVVar35->els_num = (size_t)pVVar92;
                              pVVar35->varr[sVar91] = pMVar79;
                              pMVar78 = (pMVar78->insn_link).prev;
                              unaff_RBP = local_680;
                            }
                            goto LAB_001372c7;
                          }
                          local_3d8 = (ulong)(pMVar89->nres + 2);
                          local_3e0 = &pMVar81->ops[local_3d8 - 1].u;
                          func_01 = (MIR_func_t)&DAT_00000010;
                          pMVar80 = (MIR_insn_t_conflict)0x0;
                          while( true ) {
                            if ((ulong)*(uint *)&pMVar81->field_0x1c <=
                                (long)pMVar80->ops + (local_3d8 - 0x20)) goto LAB_00136285;
                            puVar2 = (undefined8 *)((long)local_3e0 + (long)func_01 * 2);
                            local_3c8 = *puVar2;
                            uStack_3c0 = puVar2[1];
                            uStack_3b8 = puVar2[2];
                            uStack_3b0 = puVar2[3];
                            uStack_3a8 = *(undefined8 *)((long)local_3e0 + (long)func_01 * 2 + 0x20)
                            ;
                            uStack_3a0 = *(undefined8 *)((long)local_3e0 + (long)func_01 * 2 + 0x28)
                            ;
                            pVVar32 = pMVar89->vars;
                            if (((pVVar32 == (VARR_MIR_var_t *)0x0) ||
                                (pMVar33 = pVVar32->varr, pMVar33 == (MIR_var_t *)0x0)) ||
                               ((MIR_insn_t_conflict)pVVar32->els_num <= pMVar80))
                            goto LAB_00137252;
                            uVar82 = *(uint *)((long)&pMVar33[-1].name + (long)func_01);
                            pMVar88 = *(MIR_context_t *)((long)&pMVar33[-1].size + (long)func_01);
                            lVar104 = *(long *)((long)&func_01->name + (long)&pMVar33->type);
                            uVar83 = 6;
                            if ((uVar82 & 0xfffffffe) == 8) {
                              uVar83 = uVar82;
                            }
                            if (uVar82 == 10) {
                              uVar83 = uVar82;
                            }
                            prVar74 = find_rd_by_name(pMVar88,(char *)pMVar89,func_01);
                            if (prVar74 == (reg_desc_t *)0x0) break;
                            pVVar34 = local_680->simplify_ctx->inline_reg_map;
                            if (((pVVar34 == (VARR_MIR_reg_t *)0x0) ||
                                (pVVar34->varr == (MIR_reg_t *)0x0)) ||
                               (pVVar34->els_num <= (ulong)prVar74->reg)) goto LAB_0013724d;
                            MVar67 = pVVar34->varr[prVar74->reg];
                            if ((0xfffffff9 < uVar83 - 0x12) &&
                               (((char)uStack_3c0 != '\n' || (uVar83 != 6)))) {
                              __assert_fail("!MIR_all_blk_type_p (type) || (op.mode == MIR_OP_MEM && type == MIR_T_I64)"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                            ,0xfea,"void process_inlines(MIR_context_t, MIR_item_t)"
                                           );
                            }
                            if (uVar82 - 0x11 < 0xfffffffb) {
                              if (uVar82 == 0x11) {
                                local_618 = (local_618 & 0xffffff00) + 1;
                                local_3c8 = 0;
                                uStack_3c0 = CONCAT62(uStack_3c0._2_6_,(short)local_618);
                                uStack_3b8 = CONCAT44(uStack_3b8._4_4_,(undefined4)uStack_3a8);
                              }
                              if (uVar83 == 8) {
                                MVar102 = MIR_FMOV;
                              }
                              else if (uVar83 == 9) {
                                MVar102 = MIR_DMOV;
                              }
                              else {
                                MVar102 = (uint)(uVar83 == 10) * 3;
                              }
                              uStack_150 = 1;
                              local_158 = 0;
                              auVar54._9_7_ = uStack_14f;
                              auVar54._0_9_ = (unkuint9)1 << 0x40;
                              in_stack_fffffffffffff8f0 = auVar54._8_4_;
                              MStack_148 = MVar67;
                              pMVar75 = MIR_new_insn(local_680,MVar102);
                              MIR_insert_insn_before
                                        (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar75);
                            }
                            else {
                              local_608._20_4_ = (local_608._20_4_ & 0xffffff00) + 1;
                              local_608._16_4_ = (local_608._16_4_ & 0xffffff00) + 1;
                              local_610 = (MIR_insn_t_conflict)
                                          local_680->simplify_ctx->new_label_num;
                              local_128 = 0;
                              uStack_120 = (undefined2)local_608._16_4_;
                              uStack_118 = (undefined4)uStack_3a8;
                              local_338 = 0;
                              uStack_330 = (undefined2)local_608._20_4_;
                              func = ((anon_union_8_10_166bea1d_for_u *)
                                     ((long)&pMVar27->ops[0].u + 0x10))->func;
                              uVar72 = lVar104 + 7;
                              MStack_328 = MVar67;
                              MStack_4e8 = new_temp_reg(local_680,MIR_T_I64,func);
                              cStack_4f0 = '\x01';
                              local_4f8.func = (MIR_func_t)0x0;
                              uStack_5e0 = 3;
                              local_608._32_4_ = 0;
                              uStack_5e4 = 0;
                              uVar98 = uVar72 & 0xfffffffffffffff8;
                              aStack_5d8.reg = (MIR_reg_t)uVar98;
                              aStack_5d8.mem.alias = (MIR_alias_t)(uVar98 >> 0x20);
                              pMVar75 = MIR_new_insn(local_680,MIR_MOV);
                              MIR_insert_insn_before
                                        (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar75);
                              auVar52._8_2_ = uStack_330;
                              auVar52._0_8_ = local_338;
                              auVar52._10_6_ = uStack_32e;
                              in_stack_fffffffffffff8f0 = auVar52._8_4_;
                              pMVar75 = MIR_new_insn(local_680,MIR_ALLOCA);
                              MIR_insert_insn_before
                                        (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar75);
                              if ((uVar72 & 0xfffffffffffffff8) != 0) {
                                local_608._12_4_ = new_temp_reg(local_680,MIR_T_I64,func);
                                uStack_520 = 1;
                                local_528 = (MIR_item_t)0x0;
                                MStack_518 = local_608._12_4_;
                                MStack_548 = new_temp_reg(local_680,MIR_T_I64,func);
                                uStack_550 = 1;
                                local_558 = 0;
                                MStack_428 = new_temp_reg(local_680,MIR_T_I64,func);
                                uStack_430 = 1;
                                local_438 = 0;
                                MVar67 = new_temp_reg(local_680,MIR_T_I64,func);
                                pMVar75 = local_610;
                                uStack_460 = 1;
                                local_468 = 0;
                                pMStack_458 = (MIR_item_t_conflict)
                                              CONCAT44(pMStack_458._4_4_,MVar67);
                                ppvVar57 = &local_610->data;
                                pMVar78 = create_label(local_680,(int64_t)local_610);
                                local_610 = (MIR_insn_t_conflict)((long)&pMVar75->data + 2);
                                pMVar75 = create_label(local_680,(int64_t)((long)ppvVar57 + 1));
                                uStack_60 = 3;
                                local_68 = 0;
                                uStack_58 = 0;
                                local_3e8 = pMVar75;
                                pMVar79 = MIR_new_insn(local_680,MIR_MOV);
                                MIR_insert_insn_before
                                          (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar79);
                                uStack_90 = 0xc;
                                local_98 = 0;
                                pMStack_88 = pMVar75;
                                pMVar75 = MIR_new_insn(local_680,MIR_BLE);
                                MIR_insert_insn_before
                                          (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar75);
                                MIR_insert_insn_before
                                          (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar78);
                                pMVar75 = MIR_new_insn(local_680,MIR_ADD);
                                MIR_insert_insn_before
                                          (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar75);
                                uStack_360 = 10;
                                local_368 = 0;
                                uStack_358 = 0x106;
                                local_340 = 0;
                                local_348 = local_608._12_4_;
                                local_344 = 0;
                                uStack_34c = 0;
                                uStack_354 = 0;
                                uStack_350 = 0;
                                pMVar75 = MIR_new_insn(local_680,MIR_MOV);
                                MIR_insert_insn_before
                                          (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar75);
                                pMVar75 = MIR_new_insn(local_680,MIR_ADD);
                                MIR_insert_insn_before
                                          (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar75);
                                uStack_390 = 10;
                                local_398 = 0;
                                uStack_388 = 0x106;
                                local_370 = 0;
                                local_378 = local_608._12_4_;
                                local_374 = 0;
                                uStack_37c = 0;
                                uStack_384 = 0;
                                uStack_380 = 0;
                                pMVar75 = MIR_new_insn(local_680,MIR_MOV);
                                MIR_insert_insn_before
                                          (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar75);
                                uStack_c0 = 3;
                                local_c8 = 0;
                                uStack_b8 = 8;
                                pMVar75 = MIR_new_insn(local_680,MIR_MOV);
                                MIR_insert_insn_before
                                          (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar75);
                                pMVar75 = MIR_new_insn(local_680,MIR_ADD);
                                MIR_insert_insn_before
                                          (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar75);
                                uStack_f0 = 0xc;
                                local_f8 = 0;
                                auVar55._9_7_ = uStack_ef;
                                auVar55._0_9_ = (unkuint9)0xc << 0x40;
                                in_stack_fffffffffffff8f0 = auVar55._8_4_;
                                pMStack_e8 = pMVar78;
                                pMVar75 = MIR_new_insn(local_680,MIR_BLT);
                                MIR_insert_insn_before
                                          (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,pMVar75);
                                MIR_insert_insn_before
                                          (local_680,(MIR_item_t_conflict)pMVar27,pMVar73,local_3e8)
                                ;
                              }
                              local_680->simplify_ctx->new_label_num = (size_t)local_610;
                            }
                            pMVar80 = (MIR_insn_t_conflict)((long)&pMVar80->data + 1);
                            func_01 = (MIR_func_t)&func_01->insns;
                            unaff_RBP = local_680;
                            if (local_578 == pMVar80) goto LAB_00136285;
                          }
                          (*local_680->error_func)
                                    (MIR_undeclared_func_reg_error,"undeclared func reg %s",pMVar88)
                          ;
                          goto LAB_0013730f;
                        }
                      }
LAB_00135698:
                      simplify_op(unaff_RBP,(MIR_item_t_conflict)pMVar27,pMVar81,1,0,MVar102,0,
                                  in_stack_fffffffffffff8f0);
                    }
LAB_001356b5:
                    pMVar81 = pMVar73;
                  } while (pMVar73 != (MIR_insn_t_conflict)0x0);
                  unaff_R13 = (MIR_item_t_conflict)0x0;
                }
                unaff_R14 = local_560;
                pVVar92 = unaff_RBP->simplify_ctx->anchors;
                ctx = unaff_RBP;
                if (pVVar92 != (VARR_MIR_insn_t *)0x0) {
                  if (pVVar92->els_num != 0) goto LAB_00137113;
                  pVVar30 = unaff_RBP->simplify_ctx->alloca_sizes;
                  if (pVVar30 != (VARR_size_t *)0x0) {
                    if (pVVar30->els_num != 0) goto LAB_00137113;
                    if (local_630 != (MIR_insn_t_conflict)0x0) {
                      if (local_614 == 0) {
                        pMVar88 = unaff_RBP;
                        remove_insn(unaff_RBP,(MIR_item_t_conflict)pMVar27,local_630,
                                    &((anon_union_8_10_166bea1d_for_u *)
                                     ((long)&pMVar27->ops[0].u + 0x10))->func->insns);
                      }
                      else if (local_620 != local_648) {
                        MVar67 = new_temp_reg(unaff_RBP,MIR_T_I64,pMVar28);
                        cStack_4f0 = '\x01';
                        local_4f8.func = (MIR_func_t)0x0;
                        uStack_5e0 = 3;
                        local_608._32_4_ = 0;
                        uStack_5e4 = 0;
                        aStack_5d8.reg = (MIR_reg_t)local_620;
                        aStack_5d8.mem.alias = (MIR_alias_t)((ulong)local_620 >> 0x20);
                        auVar47[9] = uStack_4ef;
                        auVar47._0_9_ = (unkuint9)1 << 0x40;
                        auVar47._10_6_ = uStack_4ee;
                        in_stack_fffffffffffff8f0 = auVar47._8_4_;
                        MStack_4e8 = MVar67;
                        pMVar81 = MIR_new_insn(unaff_RBP,MIR_MOV);
                        local_630[1].data = (void *)0x0;
                        *(undefined2 *)&local_630[1].insn_link.prev = 1;
                        *(MIR_reg_t *)&local_630[1].insn_link.next = MVar67;
                        pMVar88 = unaff_RBP;
                        MIR_insert_insn_before
                                  (unaff_RBP,(MIR_item_t_conflict)pMVar27,local_630,pMVar81);
                      }
                    }
                    while( true ) {
                      psVar70 = unaff_RBP->simplify_ctx;
                      pVVar92 = psVar70->cold_insns;
                      if (pVVar92 == (VARR_MIR_insn_t *)0x0) goto LAB_00137039;
                      sVar91 = pVVar92->els_num;
                      if (sVar91 == 0) break;
                      if (pVVar92->varr == (MIR_insn_t_conflict *)0x0) goto LAB_00137046;
                      pVVar92->els_num = sVar91 - 1;
                      pMVar81 = pVVar92->varr[sVar91 - 1];
                      if (*(int *)&pMVar81->field_0x18 == 0xb4) {
                        pMVar71 = (MIR_item_t)psVar70->new_label_num;
                        psVar70->new_label_num = (size_t)((long)&pMVar71->data + 1);
                        pMVar81->ops[0].u.ref = pMVar71;
                      }
                      pMVar88 = unaff_RBP;
                      MIR_append_insn(unaff_RBP,(MIR_item_t_conflict)pMVar27,pMVar81);
                    }
                    if (unaff_RBP->curr_label_num < psVar70->new_label_num) {
                      unaff_RBP->curr_label_num = psVar70->new_label_num;
                    }
                    pMVar27->data = (void *)0x0;
                    goto LAB_00136e5e;
                  }
                  MIR_link_cold_17();
                }
                MIR_link_cold_18();
LAB_001371b1:
                unaff_R14 = (MIR_context_t)(unaff_R13->u).func;
                pcVar100 = "export of undefined item %s";
                unaff_RBP = ctx;
LAB_0013721c:
                MVar101 = MIR_undeclared_op_ref_error;
                goto LAB_00137221;
              }
            }
            MIR_link_cold_19();
LAB_00137113:
            __assert_fail("(VARR_MIR_insn_tlength (ctx->simplify_ctx->anchors)) == 0 && (VARR_size_tlength (ctx->simplify_ctx->alloca_sizes)) == 0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x1064,"void process_inlines(MIR_context_t, MIR_item_t)");
          }
LAB_00136e5e:
          pMVar99 = pMVar88;
          if (*(MIR_item_type_t *)&pMVar27->ops[0].data == MIR_expr_data_item) {
            MVar96 = **(MIR_type_t **)
                       (*(long *)((long)&((anon_union_8_10_166bea1d_for_u *)
                                         ((long)&pMVar27->ops[0].u + 0x10))->lref_data->label->ops
                                         [0].u + 0x10) + 0x48);
            uVar63 = local_598._4_6_;
            switch(MVar96) {
            case MIR_T_I8:
            case MIR_T_U8:
              local_598 = CONCAT91(local_598._1_9_,local_588);
              break;
            case MIR_T_I16:
            case MIR_T_U16:
              local_598 = CONCAT82(local_598._2_8_,CONCAT11(uStack_587,local_588));
              break;
            case MIR_T_I32:
            case MIR_T_U32:
              local_598 = CONCAT64(uVar63,CONCAT22(uStack_586,CONCAT11(uStack_587,local_588)));
              break;
            case MIR_T_I64:
            case MIR_T_U64:
            case MIR_T_P:
              local_598 = CONCAT28(local_598._8_2_,
                                   CONCAT44(uStack_584,
                                            CONCAT22(uStack_586,CONCAT11(uStack_587,local_588))));
              break;
            case MIR_T_F:
              local_598 = CONCAT64(uVar63,CONCAT22(uStack_586,CONCAT11(uStack_587,local_588)));
              break;
            case MIR_T_D:
              local_598 = CONCAT28(local_598._8_2_,
                                   CONCAT44(uStack_584,
                                            CONCAT22(uStack_586,CONCAT11(uStack_587,local_588))));
              break;
            case MIR_T_LD:
              local_598 = CONCAT28(uStack_580,
                                   CONCAT44(uStack_584,
                                            CONCAT22(uStack_586,CONCAT11(uStack_587,local_588))));
              break;
            default:
              goto switchD_00136e92_default;
            }
            pMVar99 = (MIR_context_t)
                      ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar27->ops[0].u + 0x10))->
                      expr_data->load_addr;
            sVar91 = _MIR_type_size(pMVar88,MVar96);
            memcpy(pMVar99,&local_598,sVar91);
          }
        }
        pMVar88 = pMVar99;
        pMVar21 = local_560;
        pMVar99 = local_560;
      }
      unaff_R14 = (MIR_context_t)((long)&unaff_R14->gen_ctx + 1);
      pVVar68 = unaff_RBP->modules_to_link;
      local_560 = pMVar99;
    } while (pVVar68 != (VARR_MIR_module_t *)0x0);
  }
  MIR_link_cold_23();
LAB_00136f61:
  if (local_568 == (_func_void_MIR_context_t_MIR_item_t *)0x0) {
    return;
  }
  while (pVVar68 = unaff_RBP->modules_to_link, pVVar68 != (VARR_MIR_module_t *)0x0) {
    sVar91 = pVVar68->els_num;
    if (sVar91 == 0) {
      (*local_568)(unaff_RBP,(MIR_item_t_conflict)0x0);
      return;
    }
    if (pVVar68->varr == (MIR_module_t_conflict *)0x0) goto LAB_00137317;
    pVVar68->els_num = sVar91 - 1;
    for (pMVar103 = (pVVar68->varr[sVar91 - 1]->items).head; pMVar103 != (MIR_item_t_conflict)0x0;
        pMVar103 = (pMVar103->item_link).next) {
      if (pMVar103->item_type == MIR_func_item) {
        (*local_568)(unaff_RBP,pMVar103);
      }
    }
  }
LAB_0013730f:
  MIR_link_cold_2();
LAB_00137317:
  MIR_link_cold_1();
switchD_00136e92_default:
  __assert_fail("FALSE",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x7ef,
                "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
               );
code_r0x0013567c:
  pMVar87 = *(MIR_insn_t *)&pMVar87->ops[0].field_0x8;
  if (pMVar87 == (MIR_insn_t)0x0) goto LAB_00135698;
  goto LAB_00135671;
LAB_00137039:
  MIR_link_cold_16();
  unaff_RBP = ctx;
LAB_0013703e:
  MIR_link_cold_36();
LAB_00137046:
  MIR_link_cold_15();
LAB_0013704b:
  MIR_link_cold_35();
LAB_00137053:
  MIR_link_cold_34();
LAB_0013705b:
  MIR_link_cold_14();
LAB_00137060:
  MIR_link_cold_33();
LAB_00137068:
  MIR_link_cold_4();
LAB_0013706d:
  ctx = unaff_RBP;
  MIR_link_cold_27();
LAB_00137075:
  MIR_link_cold_29();
LAB_0013707d:
  MIR_link_cold_26();
LAB_00137085:
  MIR_link_cold_25();
LAB_0013708d:
  pcVar100 = "undeclared func reg %s";
  MVar101 = MIR_undeclared_func_reg_error;
  unaff_RBP = ctx;
LAB_00137221:
  (*unaff_RBP->error_func)(MVar101,pcVar100,unaff_R14);
LAB_00137226:
  __assert_fail("(DLIST_MIR_insn_t_next (insn)) == stop_insn && call->ops[0].mode == MIR_OP_REF && call->ops[0].u.ref->item_type == MIR_proto_item"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x1027,"void process_inlines(MIR_context_t, MIR_item_t)");
}

Assistant:

void MIR_link (MIR_context_t ctx, void (*set_interface) (MIR_context_t ctx, MIR_item_t item),
               void *import_resolver (const char *)) {
  MIR_item_t item, tab_item, expr_item;
  MIR_type_t type;
  MIR_val_t res;
  MIR_module_t m;
  void *addr;
  union {
    int8_t i8;
    int16_t i16;
    int32_t i32;
    int64_t i64;
    float f;
    double d;
    long double ld;
    void *a;
  } v;

  for (size_t i = 0; i < VARR_LENGTH (MIR_module_t, modules_to_link); i++) {
    m = VARR_GET (MIR_module_t, modules_to_link, i);
    simplify_module_init (ctx);
    for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
         item = DLIST_NEXT (MIR_item_t, item))
      if (item->item_type == MIR_func_item) {
        assert (item->data == NULL);
        if (simplify_func (ctx, item, TRUE)) item->data = (void *) 1; /* flag inlining */
      } else if (item->item_type == MIR_import_item) {
        if ((tab_item = item_tab_find (ctx, item->u.import_id, &environment_module)) == NULL) {
          if (import_resolver == NULL || (addr = import_resolver (item->u.import_id)) == NULL)
            MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "import of undefined item %s",
                                      item->u.import_id);
          MIR_load_external (ctx, item->u.import_id, addr);
          tab_item = item_tab_find (ctx, item->u.import_id, &environment_module);
          mir_assert (tab_item != NULL);
        }
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      } else if (item->item_type == MIR_export_item) {
        if ((tab_item = item_tab_find (ctx, item->u.export_id, m)) == NULL)
          MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "export of undefined item %s",
                                    item->u.export_id);
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      } else if (item->item_type == MIR_forward_item) {
        if ((tab_item = item_tab_find (ctx, item->u.forward_id, m)) == NULL)
          MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "forward of undefined item %s",
                                    item->u.forward_id);
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      }
  }
  for (size_t i = 0; i < VARR_LENGTH (MIR_module_t, modules_to_link); i++) {
    m = VARR_GET (MIR_module_t, modules_to_link, i);
    for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
         item = DLIST_NEXT (MIR_item_t, item)) {
      if (item->item_type == MIR_func_item && item->data != NULL) {
        process_inlines (ctx, item);
        item->data = NULL;
#if 0
        fprintf (stderr, "+++++ Function after inlining:\n");
        MIR_output_item (ctx, stderr, item);
#endif
      } else if (item->item_type == MIR_ref_data_item) {
        assert (item->u.ref_data->ref_item->addr != NULL);
        addr = (char *) item->u.ref_data->ref_item->addr + item->u.ref_data->disp;
        memcpy (item->u.ref_data->load_addr, &addr, _MIR_type_size (ctx, MIR_T_P));
        continue;
      }
      /* lref data are set up in interpreter or generator */
      if (item->item_type != MIR_expr_data_item) continue;
      expr_item = item->u.expr_data->expr_item;
      MIR_interp (ctx, expr_item, &res, 0);
      type = expr_item->u.func->res_types[0];
      switch (type) {
      case MIR_T_I8:
      case MIR_T_U8: v.i8 = (int8_t) res.i; break;
      case MIR_T_I16:
      case MIR_T_U16: v.i16 = (int16_t) res.i; break;
      case MIR_T_I32:
      case MIR_T_U32: v.i32 = (int32_t) res.i; break;
      case MIR_T_I64:
      case MIR_T_U64: v.i64 = (int64_t) res.i; break;
      case MIR_T_F: v.f = res.f; break;
      case MIR_T_D: v.d = res.d; break;
      case MIR_T_LD: v.ld = res.ld; break;
      case MIR_T_P: v.a = res.a; break;
      default: assert (FALSE); break;
      }
      memcpy (item->u.expr_data->load_addr, &v,
              _MIR_type_size (ctx, expr_item->u.func->res_types[0]));
    }
  }
  if (set_interface != NULL) {
    while (VARR_LENGTH (MIR_module_t, modules_to_link) != 0) {
      m = VARR_POP (MIR_module_t, modules_to_link);
      for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
           item = DLIST_NEXT (MIR_item_t, item))
        if (item->item_type == MIR_func_item) {
          finish_func_interpretation (item); /* in case if it was used for expr data */
          set_interface (ctx, item);
        }
    }
    set_interface (ctx, NULL); /* finish interface setting */
  }
}